

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  _func_int *p_Var14;
  int *piVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  float *pfVar21;
  _func_int **pp_Var22;
  _func_int **pp_Var23;
  _func_int **pp_Var24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  Mat *pMVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  _func_int *p_Var48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int w;
  int iVar55;
  _func_int ***ppp_Var56;
  int y_1;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  int y;
  uint uVar62;
  void *pvVar63;
  int iVar64;
  int y_6;
  int iVar65;
  ulong uVar66;
  void *pvVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar141 [32];
  float fVar154;
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [28];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar228;
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar234 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  __m128 one;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [64];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [64];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [16];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar448 [16];
  undefined1 auVar452 [64];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [64];
  undefined1 auVar459 [64];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  float fVar485;
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [64];
  int outw_1;
  int outh_2;
  int outw;
  int h_2;
  int outh;
  int h;
  long local_1a0;
  _func_int ***local_178;
  long local_168;
  uint local_144;
  _func_int ***local_128;
  Mat local_c8;
  void *local_78;
  _func_int **local_70;
  ulong local_68;
  int local_5c;
  Mat *local_58;
  Allocator *local_50;
  long local_48;
  long local_40;
  Option *local_38;
  undefined1 auVar138 [32];
  undefined1 auVar144 [32];
  undefined1 auVar149 [32];
  undefined1 auVar223 [32];
  undefined1 auVar256 [32];
  
  iVar6 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  uVar59 = bottom_blob->elemsize;
  iVar8 = bottom_blob->elempack;
  p_Var48 = this->_vptr_Deconvolution_x86_fma[-3];
  local_144 = 1;
  if (opt->use_packing_layout == true) {
    local_144 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var48) & 7) != 0) {
      local_144 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var48) & 3) == 0) * 3 + 1;
    }
  }
  iVar54 = *(int *)(&this->field_0xd4 + (long)p_Var48);
  local_5c = *(int *)(&this->field_0xdc + (long)p_Var48);
  iVar53 = *(int *)(&this->field_0xe4 + (long)p_Var48);
  iVar52 = (*(int *)(&this->field_0xd8 + (long)p_Var48) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var48);
  iVar47 = *(int *)(&this->field_0xe8 + (long)p_Var48);
  iVar9 = *(int *)(&this->field_0xfc + (long)p_Var48);
  iVar65 = *(int *)(&this->field_0x100 + (long)p_Var48);
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elempack = 0;
  p_Var14 = this->_vptr_Deconvolution_x86_fma[-3];
  p_Var48 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_fma + (long)p_Var14);
  lVar60 = 0x10;
  local_c8.elemsize._4_4_ = (int)local_c8.refcount;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.h = (int)local_c8.elemsize;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var14) < 1) && (*(int *)(p_Var48 + 0xf0) < 1)) &&
       (*(int *)(p_Var48 + 0xf4) < 1)) && (*(int *)(p_Var48 + 0xf8) < 1)) &&
     ((*(int *)(p_Var48 + 0x104) < 1 || (*(int *)(p_Var48 + 0x108) < 1)))) {
    if (&local_c8 != top_blob) {
      piVar15 = top_blob->refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      local_c8.data = top_blob->data;
      local_c8.refcount._0_4_ = (int)top_blob->refcount;
      local_c8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_c8.elemsize._0_4_ = (int)top_blob->elemsize;
      local_c8.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
      local_c8.elempack = top_blob->elempack;
      local_c8.allocator = top_blob->allocator;
      uVar2 = top_blob->dims;
      uVar3 = top_blob->w;
      uVar4 = top_blob->h;
      uVar5 = top_blob->d;
      local_c8.c = top_blob->c;
      local_c8.cstep = top_blob->cstep;
      local_c8.dims = uVar2;
      local_c8.w = uVar3;
      local_c8.h = uVar4;
      local_c8.d = uVar5;
    }
    p_Var48 = (_func_int *)
              ((long)&this->_vptr_Deconvolution_x86_fma +
              (long)this->_vptr_Deconvolution_x86_fma[-3]);
    lVar60 = 8;
  }
  local_5c = (iVar54 + -1) * local_5c;
  local_58 = top_blob;
  local_38 = opt;
  Mat::create(&local_c8,iVar9 + (iVar6 + -1) * iVar53 + local_5c + 1,
              iVar65 + (iVar7 + -1) * iVar47 + iVar52 + 1,*(int *)(p_Var48 + 0xd0) / (int)local_144,
              (uVar59 / (ulong)(long)iVar8) * (ulong)local_144,local_144,
              *(Allocator **)(&opt->lightmode + lVar60));
  iVar7 = local_c8.h;
  iVar6 = local_c8.w;
  iVar54 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    local_70 = this->_vptr_Deconvolution_x86_fma;
    p_Var48 = local_70[-3];
    uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
    local_68 = (ulong)uVar10;
    uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
    local_78 = (void *)(ulong)uVar11;
    if ((iVar8 == 8) && ((local_144 == 8 && (0 < (long)local_c8.c)))) {
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      local_168 = 0;
      auVar387 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar395 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar340 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar455._8_4_ = 0x3d2aa9c1;
      auVar455._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar455._12_4_ = 0x3d2aa9c1;
      auVar455._16_4_ = 0x3d2aa9c1;
      auVar455._20_4_ = 0x3d2aa9c1;
      auVar455._24_4_ = 0x3d2aa9c1;
      auVar455._28_4_ = 0x3d2aa9c1;
      auVar147._8_4_ = 0xbf800000;
      auVar147._0_8_ = 0xbf800000bf800000;
      auVar147._12_4_ = 0xbf800000;
      auVar147._16_4_ = 0xbf800000;
      auVar147._20_4_ = 0xbf800000;
      auVar147._24_4_ = 0xbf800000;
      auVar147._28_4_ = 0xbf800000;
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_168 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar152 = ZEXT3264(*(undefined1 (*) [32])(lVar60 + local_168 * 0x20));
                }
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_168 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar66 = 0;
                      pvVar63 = (void *)0x0;
                      do {
                        iVar41 = (((int)pvVar63 - uVar11) + 1) * iVar53 + iVar55;
                        if ((((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                            (0 < (int)uVar10)) && (iVar42 < iVar46)) {
                          lVar51 = (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar57 = uVar66;
                          uVar61 = local_68;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar42 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar42 < iVar65)) {
                              lVar49 = (long)(iVar42 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51);
                              auVar141._4_4_ = uVar1;
                              auVar141._0_4_ = uVar1;
                              auVar141._8_4_ = uVar1;
                              auVar141._12_4_ = uVar1;
                              auVar141._16_4_ = uVar1;
                              auVar141._20_4_ = uVar1;
                              auVar141._24_4_ = uVar1;
                              auVar141._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 4);
                              auVar143._4_4_ = uVar1;
                              auVar143._0_4_ = uVar1;
                              auVar143._8_4_ = uVar1;
                              auVar143._12_4_ = uVar1;
                              auVar143._16_4_ = uVar1;
                              auVar143._20_4_ = uVar1;
                              auVar143._24_4_ = uVar1;
                              auVar143._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 8);
                              auVar137._4_4_ = uVar1;
                              auVar137._0_4_ = uVar1;
                              auVar137._8_4_ = uVar1;
                              auVar137._12_4_ = uVar1;
                              auVar137._16_4_ = uVar1;
                              auVar137._20_4_ = uVar1;
                              auVar137._24_4_ = uVar1;
                              auVar137._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0xc);
                              auVar219._4_4_ = uVar1;
                              auVar219._0_4_ = uVar1;
                              auVar219._8_4_ = uVar1;
                              auVar219._12_4_ = uVar1;
                              auVar219._16_4_ = uVar1;
                              auVar219._20_4_ = uVar1;
                              auVar219._24_4_ = uVar1;
                              auVar219._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x10);
                              auVar208._4_4_ = uVar1;
                              auVar208._0_4_ = uVar1;
                              auVar208._8_4_ = uVar1;
                              auVar208._12_4_ = uVar1;
                              auVar208._16_4_ = uVar1;
                              auVar208._20_4_ = uVar1;
                              auVar208._24_4_ = uVar1;
                              auVar208._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x14);
                              auVar475._4_4_ = uVar1;
                              auVar475._0_4_ = uVar1;
                              auVar475._8_4_ = uVar1;
                              auVar475._12_4_ = uVar1;
                              auVar475._16_4_ = uVar1;
                              auVar475._20_4_ = uVar1;
                              auVar475._24_4_ = uVar1;
                              auVar475._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x18);
                              auVar444._4_4_ = uVar1;
                              auVar444._0_4_ = uVar1;
                              auVar444._8_4_ = uVar1;
                              auVar444._12_4_ = uVar1;
                              auVar444._16_4_ = uVar1;
                              auVar444._20_4_ = uVar1;
                              auVar444._24_4_ = uVar1;
                              auVar444._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x1c);
                              auVar449._4_4_ = uVar1;
                              auVar449._0_4_ = uVar1;
                              auVar449._8_4_ = uVar1;
                              auVar449._12_4_ = uVar1;
                              auVar449._16_4_ = uVar1;
                              auVar449._20_4_ = uVar1;
                              auVar449._24_4_ = uVar1;
                              auVar449._28_4_ = uVar1;
                              uVar58 = uVar57 & 0xffffffff;
                              auVar230 = vfmadd231ps_fma(auVar152._0_32_,auVar141,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar143,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0x20));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar137,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0x40));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar219,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0x60));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar208,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0x80));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar475,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0xa0));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar444,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0xc0));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar449,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar58 * 4 + 0xe0));
                              auVar152 = ZEXT1664(auVar230);
                            }
                            uVar57 = uVar57 + 0x40;
                            iVar41 = iVar41 + iVar54;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        pvVar63 = (void *)((long)pvVar63 + 1);
                        uVar66 = uVar66 + local_68 * 0x40;
                      } while (pvVar63 != local_78);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 0x40) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar141 = auVar152._0_32_;
                auVar137 = auVar387._0_32_;
                auVar143 = auVar340._0_32_;
                auVar219 = auVar395._0_32_;
                fVar69 = auVar340._0_4_;
                fVar68 = auVar340._4_4_;
                fVar485 = auVar340._8_4_;
                fVar228 = auVar340._12_4_;
                fVar229 = auVar340._16_4_;
                fVar25 = auVar340._20_4_;
                fVar154 = auVar340._24_4_;
                fVar26 = auVar340._28_4_;
                auVar458._28_36_ = auVar152._28_36_;
                switch(uVar12) {
                case 1:
                  auVar141 = vmaxps_avx(auVar137,auVar141);
                  break;
                case 2:
                  auVar143 = vmaxps_avx(auVar137,auVar141);
                  auVar141 = vminps_avx(auVar137,auVar141);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar140._4_4_ = uVar1;
                  auVar140._0_4_ = uVar1;
                  auVar140._8_4_ = uVar1;
                  auVar140._12_4_ = uVar1;
                  auVar140._16_4_ = uVar1;
                  auVar140._20_4_ = uVar1;
                  auVar140._24_4_ = uVar1;
                  auVar140._28_4_ = uVar1;
                  auVar230 = vfmadd213ps_fma(auVar140,auVar141,auVar143);
                  auVar141 = ZEXT1632(auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar201._4_4_ = uVar1;
                  auVar201._0_4_ = uVar1;
                  auVar201._8_4_ = uVar1;
                  auVar201._12_4_ = uVar1;
                  auVar201._16_4_ = uVar1;
                  auVar201._20_4_ = uVar1;
                  auVar201._24_4_ = uVar1;
                  auVar201._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar478._4_4_ = uVar1;
                  auVar478._0_4_ = uVar1;
                  auVar478._8_4_ = uVar1;
                  auVar478._12_4_ = uVar1;
                  auVar478._16_4_ = uVar1;
                  auVar478._20_4_ = uVar1;
                  auVar478._24_4_ = uVar1;
                  auVar478._28_4_ = uVar1;
                  auVar141 = vmaxps_avx(auVar141,auVar201);
                  auVar141 = vminps_avx(auVar478,auVar141);
                  break;
                case 4:
                  auVar136._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
                  auVar136._8_4_ = -auVar152._8_4_;
                  auVar136._12_4_ = -auVar152._12_4_;
                  auVar136._16_4_ = -auVar152._16_4_;
                  auVar136._20_4_ = -auVar152._20_4_;
                  auVar136._24_4_ = -auVar152._24_4_;
                  auVar136._28_4_ = auVar152._28_4_ ^ 0x80000000;
                  auVar202._8_4_ = 0x42b0c0a5;
                  auVar202._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar202._12_4_ = 0x42b0c0a5;
                  auVar202._16_4_ = 0x42b0c0a5;
                  auVar202._20_4_ = 0x42b0c0a5;
                  auVar202._24_4_ = 0x42b0c0a5;
                  auVar202._28_4_ = 0x42b0c0a5;
                  auVar141 = vminps_avx(auVar136,auVar202);
                  auVar203._8_4_ = 0xc2b0c0a5;
                  auVar203._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar203._12_4_ = 0xc2b0c0a5;
                  auVar203._16_4_ = 0xc2b0c0a5;
                  auVar203._20_4_ = 0xc2b0c0a5;
                  auVar203._24_4_ = 0xc2b0c0a5;
                  auVar203._28_4_ = 0xc2b0c0a5;
                  auVar137 = vmaxps_avx(auVar141,auVar203);
                  auVar204._8_4_ = 0x3fb8aa3b;
                  auVar204._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar204._12_4_ = 0x3fb8aa3b;
                  auVar204._16_4_ = 0x3fb8aa3b;
                  auVar204._20_4_ = 0x3fb8aa3b;
                  auVar204._24_4_ = 0x3fb8aa3b;
                  auVar204._28_4_ = 0x3fb8aa3b;
                  auVar230 = vfmadd213ps_fma(auVar204,auVar137,auVar219);
                  auVar208 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar141 = vcmpps_avx(ZEXT1632(auVar230),auVar208,1);
                  auVar141 = vandps_avx(auVar141,auVar143);
                  auVar141 = vsubps_avx(auVar208,auVar141);
                  auVar89._8_4_ = 0x3f318000;
                  auVar89._0_8_ = 0x3f3180003f318000;
                  auVar89._12_4_ = 0x3f318000;
                  auVar89._16_4_ = 0x3f318000;
                  auVar89._20_4_ = 0x3f318000;
                  auVar89._24_4_ = 0x3f318000;
                  auVar89._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar137,auVar141,auVar89);
                  auVar244._8_4_ = 0x395e8083;
                  auVar244._0_8_ = 0x395e8083395e8083;
                  auVar244._12_4_ = 0x395e8083;
                  auVar244._16_4_ = 0x395e8083;
                  auVar244._20_4_ = 0x395e8083;
                  auVar244._24_4_ = 0x395e8083;
                  auVar244._28_4_ = 0x395e8083;
                  auVar396 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar141,auVar244);
                  auVar137 = ZEXT1632(auVar396);
                  auVar30._28_4_ = auVar208._28_4_;
                  auVar30._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar412._8_4_ = 0x39506967;
                  auVar412._0_8_ = 0x3950696739506967;
                  auVar412._12_4_ = 0x39506967;
                  auVar412._16_4_ = 0x39506967;
                  auVar412._20_4_ = 0x39506967;
                  auVar412._24_4_ = 0x39506967;
                  auVar412._28_4_ = 0x39506967;
                  auVar245._8_4_ = 0x3ab743ce;
                  auVar245._0_8_ = 0x3ab743ce3ab743ce;
                  auVar245._12_4_ = 0x3ab743ce;
                  auVar245._16_4_ = 0x3ab743ce;
                  auVar245._20_4_ = 0x3ab743ce;
                  auVar245._24_4_ = 0x3ab743ce;
                  auVar245._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar412,auVar137,auVar245);
                  auVar90._8_4_ = 0x3c088908;
                  auVar90._0_8_ = 0x3c0889083c088908;
                  auVar90._12_4_ = 0x3c088908;
                  auVar90._16_4_ = 0x3c088908;
                  auVar90._20_4_ = 0x3c088908;
                  auVar90._24_4_ = 0x3c088908;
                  auVar90._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar90);
                  auVar91._8_4_ = 0x3d2aa9c1;
                  auVar91._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar91._12_4_ = 0x3d2aa9c1;
                  auVar91._16_4_ = 0x3d2aa9c1;
                  auVar91._20_4_ = 0x3d2aa9c1;
                  auVar91._24_4_ = 0x3d2aa9c1;
                  auVar91._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar91);
                  auVar92._8_4_ = 0x3e2aaaaa;
                  auVar92._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar92._12_4_ = 0x3e2aaaaa;
                  auVar92._16_4_ = 0x3e2aaaaa;
                  auVar92._20_4_ = 0x3e2aaaaa;
                  auVar92._24_4_ = 0x3e2aaaaa;
                  auVar92._28_4_ = 0x3e2aaaaa;
                  auVar137 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar92);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar219);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar30,auVar137);
                  auVar111._0_4_ = (int)auVar141._0_4_;
                  auVar111._4_4_ = (int)auVar141._4_4_;
                  auVar111._8_4_ = (int)auVar141._8_4_;
                  auVar111._12_4_ = (int)auVar141._12_4_;
                  auVar138._16_4_ = (int)auVar141._16_4_;
                  auVar138._0_16_ = auVar111;
                  auVar138._20_4_ = (int)auVar141._20_4_;
                  auVar138._24_4_ = (int)auVar141._24_4_;
                  auVar138._28_4_ = (int)auVar141._28_4_;
                  auVar396 = vpslld_avx(auVar111,0x17);
                  auVar230 = vpslld_avx(auVar138._16_16_,0x17);
                  auVar70._8_4_ = 0x3f800000;
                  auVar70._0_8_ = 0x3f8000003f800000;
                  auVar70._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar70);
                  auVar396 = vpaddd_avx(auVar396,auVar70);
                  auVar139._16_16_ = auVar230;
                  auVar139._0_16_ = auVar396;
                  auVar205._0_4_ = auVar349._0_4_ + fVar69;
                  auVar205._4_4_ = auVar349._4_4_ + fVar68;
                  auVar205._8_4_ = auVar349._8_4_ + fVar485;
                  auVar205._12_4_ = auVar349._12_4_ + fVar228;
                  auVar205._16_4_ = fVar229 + 0.0;
                  auVar205._20_4_ = fVar25 + 0.0;
                  auVar205._24_4_ = fVar154 + 0.0;
                  auVar205._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar139,auVar205,auVar143);
                  auVar141 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar141,auVar143);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar141,auVar141);
                  auVar141 = ZEXT1632(auVar230);
                  break;
                case 5:
                  auVar445._8_4_ = 0x42b0c0a5;
                  auVar445._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar445._12_4_ = 0x42b0c0a5;
                  auVar445._16_4_ = 0x42b0c0a5;
                  auVar445._20_4_ = 0x42b0c0a5;
                  auVar445._24_4_ = 0x42b0c0a5;
                  auVar445._28_4_ = 0x42b0c0a5;
                  auVar141 = vminps_avx(auVar445,auVar141);
                  auVar450._8_4_ = 0xc2b0c0a5;
                  auVar450._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar450._12_4_ = 0xc2b0c0a5;
                  auVar450._16_4_ = 0xc2b0c0a5;
                  auVar450._20_4_ = 0xc2b0c0a5;
                  auVar450._24_4_ = 0xc2b0c0a5;
                  auVar450._28_4_ = 0xc2b0c0a5;
                  auVar137 = vmaxps_avx(auVar450,auVar141);
                  auVar408._8_4_ = 0x3fb8aa3b;
                  auVar408._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar408._12_4_ = 0x3fb8aa3b;
                  auVar408._16_4_ = 0x3fb8aa3b;
                  auVar408._20_4_ = 0x3fb8aa3b;
                  auVar408._24_4_ = 0x3fb8aa3b;
                  auVar408._28_4_ = 0x3fb8aa3b;
                  auVar230 = vfmadd213ps_fma(auVar408,auVar137,auVar219);
                  auVar208 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar141 = vcmpps_avx(ZEXT1632(auVar230),auVar208,1);
                  auVar141 = vandps_avx(auVar141,auVar143);
                  auVar141 = vsubps_avx(auVar208,auVar141);
                  auVar366._8_4_ = 0x3f318000;
                  auVar366._0_8_ = 0x3f3180003f318000;
                  auVar366._12_4_ = 0x3f318000;
                  auVar366._16_4_ = 0x3f318000;
                  auVar366._20_4_ = 0x3f318000;
                  auVar366._24_4_ = 0x3f318000;
                  auVar366._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar137,auVar141,auVar366);
                  auVar446._8_4_ = 0xb95e8083;
                  auVar446._0_8_ = 0xb95e8083b95e8083;
                  auVar446._12_4_ = 0xb95e8083;
                  auVar446._16_4_ = 0xb95e8083;
                  auVar446._20_4_ = 0xb95e8083;
                  auVar446._24_4_ = 0xb95e8083;
                  auVar446._28_4_ = 0xb95e8083;
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar141,auVar446);
                  auVar137 = ZEXT1632(auVar396);
                  auVar27._28_4_ = auVar208._28_4_;
                  auVar27._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar236._8_4_ = 0x39506967;
                  auVar236._0_8_ = 0x3950696739506967;
                  auVar236._12_4_ = 0x39506967;
                  auVar236._16_4_ = 0x39506967;
                  auVar236._20_4_ = 0x39506967;
                  auVar236._24_4_ = 0x39506967;
                  auVar236._28_4_ = 0x39506967;
                  auVar393._8_4_ = 0x3ab743ce;
                  auVar393._0_8_ = 0x3ab743ce3ab743ce;
                  auVar393._12_4_ = 0x3ab743ce;
                  auVar393._16_4_ = 0x3ab743ce;
                  auVar393._20_4_ = 0x3ab743ce;
                  auVar393._24_4_ = 0x3ab743ce;
                  auVar393._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar236,auVar137,auVar393);
                  auVar451._8_4_ = 0x3c088908;
                  auVar451._0_8_ = 0x3c0889083c088908;
                  auVar451._12_4_ = 0x3c088908;
                  auVar451._16_4_ = 0x3c088908;
                  auVar451._20_4_ = 0x3c088908;
                  auVar451._24_4_ = 0x3c088908;
                  auVar451._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar451);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar455);
                  auVar394._8_4_ = 0x3e2aaaaa;
                  auVar394._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar394._12_4_ = 0x3e2aaaaa;
                  auVar394._16_4_ = 0x3e2aaaaa;
                  auVar394._20_4_ = 0x3e2aaaaa;
                  auVar394._24_4_ = 0x3e2aaaaa;
                  auVar394._28_4_ = 0x3e2aaaaa;
                  auVar137 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar394);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar219);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar27,auVar137);
                  auVar195._0_4_ = auVar230._0_4_ + fVar69;
                  auVar195._4_4_ = auVar230._4_4_ + fVar68;
                  auVar195._8_4_ = auVar230._8_4_ + fVar485;
                  auVar195._12_4_ = auVar230._12_4_ + fVar228;
                  auVar195._16_4_ = fVar229 + 0.0;
                  auVar195._20_4_ = fVar25 + 0.0;
                  auVar195._24_4_ = fVar154 + 0.0;
                  auVar195._28_4_ = fVar26 + 0.0;
                  auVar396._0_4_ = (int)auVar141._0_4_;
                  auVar396._4_4_ = (int)auVar141._4_4_;
                  auVar396._8_4_ = (int)auVar141._8_4_;
                  auVar396._12_4_ = (int)auVar141._12_4_;
                  auVar237._16_4_ = (int)auVar141._16_4_;
                  auVar237._0_16_ = auVar396;
                  auVar237._20_4_ = (int)auVar141._20_4_;
                  auVar237._24_4_ = (int)auVar141._24_4_;
                  auVar237._28_4_ = (int)auVar141._28_4_;
                  auVar396 = vpslld_avx(auVar396,0x17);
                  auVar230 = vpslld_avx(auVar237._16_16_,0x17);
                  auVar127._8_4_ = 0x3f800000;
                  auVar127._0_8_ = 0x3f8000003f800000;
                  auVar127._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar127);
                  auVar396 = vpaddd_avx(auVar396,auVar127);
                  auVar476._16_16_ = auVar230;
                  auVar476._0_16_ = auVar396;
                  auVar349 = vfmadd213ps_fma(auVar476,auVar195,auVar143);
                  auVar196._8_4_ = 0x800000;
                  auVar196._0_8_ = 0x80000000800000;
                  auVar196._12_4_ = 0x800000;
                  auVar196._16_4_ = 0x800000;
                  auVar196._20_4_ = 0x800000;
                  auVar196._24_4_ = 0x800000;
                  auVar196._28_4_ = 0x800000;
                  auVar141 = vmaxps_avx(ZEXT1632(auVar349),auVar196);
                  auVar396 = vpsrld_avx(auVar141._0_16_,0x17);
                  auVar230 = vpsrld_avx(auVar141._16_16_,0x17);
                  auVar333._8_4_ = 0x807fffff;
                  auVar333._0_8_ = 0x807fffff807fffff;
                  auVar333._12_4_ = 0x807fffff;
                  auVar333._16_4_ = 0x807fffff;
                  auVar333._20_4_ = 0x807fffff;
                  auVar333._24_4_ = 0x807fffff;
                  auVar333._28_4_ = 0x807fffff;
                  auVar141 = vandps_avx(auVar141,auVar333);
                  auVar208 = vorps_avx(auVar141,auVar219);
                  auVar334._8_4_ = 0x3f3504f3;
                  auVar334._0_8_ = 0x3f3504f33f3504f3;
                  auVar334._12_4_ = 0x3f3504f3;
                  auVar334._16_4_ = 0x3f3504f3;
                  auVar334._20_4_ = 0x3f3504f3;
                  auVar334._24_4_ = 0x3f3504f3;
                  auVar334._28_4_ = 0x3f3504f3;
                  auVar137 = vcmpps_avx(auVar334,auVar208,2);
                  auVar141 = vandnps_avx(auVar137,auVar208);
                  auVar197._0_4_ = auVar141._0_4_ + auVar208._0_4_ + -1.0;
                  auVar197._4_4_ = auVar141._4_4_ + auVar208._4_4_ + -1.0;
                  auVar197._8_4_ = auVar141._8_4_ + auVar208._8_4_ + -1.0;
                  auVar197._12_4_ = auVar141._12_4_ + auVar208._12_4_ + -1.0;
                  auVar197._16_4_ = auVar141._16_4_ + auVar208._16_4_ + -1.0;
                  auVar197._20_4_ = auVar141._20_4_ + auVar208._20_4_ + -1.0;
                  auVar197._24_4_ = auVar141._24_4_ + auVar208._24_4_ + -1.0;
                  auVar197._28_4_ = auVar141._28_4_ + auVar208._28_4_ + -1.0;
                  auVar230 = vpsubd_avx(auVar230,auVar137._16_16_);
                  auVar418._8_4_ = 0xffffff81;
                  auVar418._0_8_ = 0xffffff81ffffff81;
                  auVar418._12_4_ = 0xffffff81;
                  auVar230 = vpaddd_avx(auVar230,auVar418);
                  auVar396 = vpsubd_avx(auVar396,auVar137._0_16_);
                  auVar396 = vpaddd_avx(auVar418,auVar396);
                  auVar238._16_16_ = auVar230;
                  auVar238._0_16_ = auVar396;
                  auVar28._4_4_ = auVar197._4_4_ * auVar197._4_4_;
                  auVar28._0_4_ = auVar197._0_4_ * auVar197._0_4_;
                  auVar28._8_4_ = auVar197._8_4_ * auVar197._8_4_;
                  auVar28._12_4_ = auVar197._12_4_ * auVar197._12_4_;
                  auVar28._16_4_ = auVar197._16_4_ * auVar197._16_4_;
                  auVar28._20_4_ = auVar197._20_4_ * auVar197._20_4_;
                  auVar28._24_4_ = auVar197._24_4_ * auVar197._24_4_;
                  auVar28._28_4_ = auVar137._28_4_;
                  auVar409._8_4_ = 0x3d9021bb;
                  auVar409._0_8_ = 0x3d9021bb3d9021bb;
                  auVar409._12_4_ = 0x3d9021bb;
                  auVar409._16_4_ = 0x3d9021bb;
                  auVar409._20_4_ = 0x3d9021bb;
                  auVar409._24_4_ = 0x3d9021bb;
                  auVar409._28_4_ = 0x3d9021bb;
                  auVar426._8_4_ = 0xbdebd1b8;
                  auVar426._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar426._12_4_ = 0xbdebd1b8;
                  auVar426._16_4_ = 0xbdebd1b8;
                  auVar426._20_4_ = 0xbdebd1b8;
                  auVar426._24_4_ = 0xbdebd1b8;
                  auVar426._28_4_ = 0xbdebd1b8;
                  auVar230 = vfmadd213ps_fma(auVar409,auVar197,auVar426);
                  auVar427._8_4_ = 0x3def251a;
                  auVar427._0_8_ = 0x3def251a3def251a;
                  auVar427._12_4_ = 0x3def251a;
                  auVar427._16_4_ = 0x3def251a;
                  auVar427._20_4_ = 0x3def251a;
                  auVar427._24_4_ = 0x3def251a;
                  auVar427._28_4_ = 0x3def251a;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar427);
                  auVar428._8_4_ = 0xbdfe5d4f;
                  auVar428._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar428._12_4_ = 0xbdfe5d4f;
                  auVar428._16_4_ = 0xbdfe5d4f;
                  auVar428._20_4_ = 0xbdfe5d4f;
                  auVar428._24_4_ = 0xbdfe5d4f;
                  auVar428._28_4_ = 0xbdfe5d4f;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar428);
                  auVar429._8_4_ = 0x3e11e9bf;
                  auVar429._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar429._12_4_ = 0x3e11e9bf;
                  auVar429._16_4_ = 0x3e11e9bf;
                  auVar429._20_4_ = 0x3e11e9bf;
                  auVar429._24_4_ = 0x3e11e9bf;
                  auVar429._28_4_ = 0x3e11e9bf;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar429);
                  auVar430._8_4_ = 0xbe2aae50;
                  auVar430._0_8_ = 0xbe2aae50be2aae50;
                  auVar430._12_4_ = 0xbe2aae50;
                  auVar430._16_4_ = 0xbe2aae50;
                  auVar430._20_4_ = 0xbe2aae50;
                  auVar430._24_4_ = 0xbe2aae50;
                  auVar430._28_4_ = 0xbe2aae50;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar430);
                  auVar431._8_4_ = 0x3e4cceac;
                  auVar431._0_8_ = 0x3e4cceac3e4cceac;
                  auVar431._12_4_ = 0x3e4cceac;
                  auVar431._16_4_ = 0x3e4cceac;
                  auVar431._20_4_ = 0x3e4cceac;
                  auVar431._24_4_ = 0x3e4cceac;
                  auVar431._28_4_ = 0x3e4cceac;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar431);
                  auVar432._8_4_ = 0xbe7ffffc;
                  auVar432._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar432._12_4_ = 0xbe7ffffc;
                  auVar432._16_4_ = 0xbe7ffffc;
                  auVar432._20_4_ = 0xbe7ffffc;
                  auVar432._24_4_ = 0xbe7ffffc;
                  auVar432._28_4_ = 0xbe7ffffc;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar432);
                  auVar433._8_4_ = 0x3eaaaaaa;
                  auVar433._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar433._12_4_ = 0x3eaaaaaa;
                  auVar433._16_4_ = 0x3eaaaaaa;
                  auVar433._20_4_ = 0x3eaaaaaa;
                  auVar433._24_4_ = 0x3eaaaaaa;
                  auVar433._28_4_ = 0x3eaaaaaa;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar197,auVar433);
                  auVar410._0_4_ = auVar197._0_4_ * auVar197._0_4_ * auVar197._0_4_ * auVar230._0_4_
                  ;
                  auVar410._4_4_ = auVar197._4_4_ * auVar197._4_4_ * auVar197._4_4_ * auVar230._4_4_
                  ;
                  auVar410._8_4_ = auVar197._8_4_ * auVar197._8_4_ * auVar197._8_4_ * auVar230._8_4_
                  ;
                  auVar410._12_4_ =
                       auVar197._12_4_ * auVar197._12_4_ * auVar197._12_4_ * auVar230._12_4_;
                  auVar410._16_4_ = auVar197._16_4_ * auVar197._16_4_ * auVar197._16_4_ * 0.0;
                  auVar410._20_4_ = auVar197._20_4_ * auVar197._20_4_ * auVar197._20_4_ * 0.0;
                  auVar410._24_4_ = auVar197._24_4_ * auVar197._24_4_ * auVar197._24_4_ * 0.0;
                  auVar410._28_4_ = 0;
                  auVar137 = vcvtdq2ps_avx(auVar238);
                  auVar230 = vfmadd231ps_fma(auVar410,auVar137,auVar446);
                  auVar230 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar219,auVar28);
                  auVar141 = vcmpps_avx(ZEXT1632(auVar349),_DAT_005516a0,2);
                  auVar208 = vsubps_avx(ZEXT1632(auVar230),auVar197);
                  auVar230 = vfmsub231ps_fma(auVar208,auVar366,auVar137);
                  auVar477._8_4_ = 0xc0000000;
                  auVar477._0_8_ = 0xc0000000c0000000;
                  auVar477._12_4_ = 0xc0000000;
                  auVar477._16_4_ = 0xc0000000;
                  auVar477._20_4_ = 0xc0000000;
                  auVar477._24_4_ = 0xc0000000;
                  auVar477._28_4_ = 0xc0000000;
                  auVar198._0_4_ = auVar230._0_4_ * -2.0;
                  auVar198._4_4_ = auVar230._4_4_ * -2.0;
                  auVar198._8_4_ = auVar230._8_4_ * -2.0;
                  auVar198._12_4_ = auVar230._12_4_ * -2.0;
                  auVar198._16_4_ = 0x80000000;
                  auVar198._20_4_ = 0x80000000;
                  auVar198._24_4_ = 0x80000000;
                  auVar198._28_4_ = 0;
                  auVar239._8_4_ = 0x7fffffff;
                  auVar239._0_8_ = 0x7fffffff7fffffff;
                  auVar239._12_4_ = 0x7fffffff;
                  auVar239._16_4_ = 0x7fffffff;
                  auVar239._20_4_ = 0x7fffffff;
                  auVar239._24_4_ = 0x7fffffff;
                  auVar239._28_4_ = 0x7fffffff;
                  auVar141 = vblendvps_avx(auVar198,auVar239,auVar141);
                  auVar240._8_4_ = 0x42b0c0a5;
                  auVar240._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar240._12_4_ = 0x42b0c0a5;
                  auVar240._16_4_ = 0x42b0c0a5;
                  auVar240._20_4_ = 0x42b0c0a5;
                  auVar240._24_4_ = 0x42b0c0a5;
                  auVar240._28_4_ = 0x42b0c0a5;
                  auVar141 = vminps_avx(auVar141,auVar240);
                  auVar241._8_4_ = 0xc2b0c0a5;
                  auVar241._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar241._12_4_ = 0xc2b0c0a5;
                  auVar241._16_4_ = 0xc2b0c0a5;
                  auVar241._20_4_ = 0xc2b0c0a5;
                  auVar241._24_4_ = 0xc2b0c0a5;
                  auVar241._28_4_ = 0xc2b0c0a5;
                  auVar137 = vmaxps_avx(auVar141,auVar241);
                  auVar242._8_4_ = 0x3fb8aa3b;
                  auVar242._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar242._12_4_ = 0x3fb8aa3b;
                  auVar242._16_4_ = 0x3fb8aa3b;
                  auVar242._20_4_ = 0x3fb8aa3b;
                  auVar242._24_4_ = 0x3fb8aa3b;
                  auVar242._28_4_ = 0x3fb8aa3b;
                  auVar230 = vfmadd213ps_fma(auVar242,auVar137,auVar219);
                  auVar208 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar141 = vcmpps_avx(ZEXT1632(auVar230),auVar208,1);
                  auVar141 = vandps_avx(auVar141,auVar143);
                  auVar141 = vsubps_avx(auVar208,auVar141);
                  auVar230 = vfmsub231ps_fma(auVar137,auVar141,auVar366);
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar141,auVar446);
                  auVar137 = ZEXT1632(auVar396);
                  auVar29._28_4_ = auVar208._28_4_;
                  auVar29._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar411._8_4_ = 0x39506967;
                  auVar411._0_8_ = 0x3950696739506967;
                  auVar411._12_4_ = 0x39506967;
                  auVar411._16_4_ = 0x39506967;
                  auVar411._20_4_ = 0x39506967;
                  auVar411._24_4_ = 0x39506967;
                  auVar411._28_4_ = 0x39506967;
                  auVar387 = ZEXT864(0) << 0x20;
                  auVar434._8_4_ = 0x3ab743ce;
                  auVar434._0_8_ = 0x3ab743ce3ab743ce;
                  auVar434._12_4_ = 0x3ab743ce;
                  auVar434._16_4_ = 0x3ab743ce;
                  auVar434._20_4_ = 0x3ab743ce;
                  auVar434._24_4_ = 0x3ab743ce;
                  auVar434._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar411,auVar137,auVar434);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar451);
                  auVar340 = ZEXT3264(auVar143);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar455);
                  auVar137 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar394);
                  auVar395 = ZEXT3264(auVar219);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar137,auVar219);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar29,auVar137);
                  auVar230._0_4_ = (int)auVar141._0_4_;
                  auVar230._4_4_ = (int)auVar141._4_4_;
                  auVar230._8_4_ = (int)auVar141._8_4_;
                  auVar230._12_4_ = (int)auVar141._12_4_;
                  auVar199._16_4_ = (int)auVar141._16_4_;
                  auVar199._0_16_ = auVar230;
                  auVar199._20_4_ = (int)auVar141._20_4_;
                  auVar199._24_4_ = (int)auVar141._24_4_;
                  auVar199._28_4_ = (int)auVar141._28_4_;
                  auVar396 = vpslld_avx(auVar230,0x17);
                  auVar230 = vpslld_avx(auVar199._16_16_,0x17);
                  auVar230 = vpaddd_avx(auVar230,auVar127);
                  auVar396 = vpaddd_avx(auVar396,auVar127);
                  auVar200._16_16_ = auVar230;
                  auVar200._0_16_ = auVar396;
                  auVar243._0_4_ = auVar349._0_4_ + fVar69;
                  auVar243._4_4_ = auVar349._4_4_ + fVar68;
                  auVar243._8_4_ = auVar349._8_4_ + fVar485;
                  auVar243._12_4_ = auVar349._12_4_ + fVar228;
                  auVar243._16_4_ = fVar229 + 0.0;
                  auVar243._20_4_ = fVar25 + 0.0;
                  auVar243._24_4_ = fVar154 + 0.0;
                  auVar243._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar200,auVar243,auVar143);
                  auVar141 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar141,auVar143);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar141,auVar141);
                  auVar230 = vfnmadd213ps_fma(ZEXT1632(auVar230),auVar477,auVar147);
                  auVar194 = ZEXT1628(auVar230);
                  goto LAB_002b9b9e;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar206._4_4_ = uVar1;
                  auVar206._0_4_ = uVar1;
                  auVar206._8_4_ = uVar1;
                  auVar206._12_4_ = uVar1;
                  auVar206._16_4_ = uVar1;
                  auVar206._20_4_ = uVar1;
                  auVar206._24_4_ = uVar1;
                  auVar206._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar246._4_4_ = uVar1;
                  auVar246._0_4_ = uVar1;
                  auVar246._8_4_ = uVar1;
                  auVar246._12_4_ = uVar1;
                  auVar246._16_4_ = uVar1;
                  auVar246._20_4_ = uVar1;
                  auVar246._24_4_ = uVar1;
                  auVar246._28_4_ = uVar1;
                  auVar230 = vfmadd231ps_fma(auVar246,auVar141,auVar206);
                  auVar141 = vmaxps_avx(auVar137,ZEXT1632(auVar230));
                  auVar141 = vminps_avx(auVar141,auVar143);
                  auVar194 = auVar141._0_28_;
LAB_002b9b9e:
                  auVar458._0_4_ = auVar194._0_4_ * auVar152._0_4_;
                  auVar458._4_4_ = auVar194._4_4_ * auVar152._4_4_;
                  auVar458._8_4_ = auVar194._8_4_ * auVar152._8_4_;
                  auVar458._12_4_ = auVar194._12_4_ * auVar152._12_4_;
                  auVar458._16_4_ = auVar194._16_4_ * auVar152._16_4_;
                  auVar458._20_4_ = auVar194._20_4_ * auVar152._20_4_;
                  auVar458._24_4_ = auVar194._24_4_ * auVar152._24_4_;
                  auVar141 = auVar458._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var56 = auVar141;
                ppp_Var56 = ppp_Var56 + 4;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_168 = local_168 + 1;
      } while (local_168 != local_c8.c);
    }
    if (((iVar8 == 4) && (local_144 == 8)) && (0 < (long)local_c8.c)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_1a0 = 0;
      auVar395 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar340 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar152 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar387 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar458 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_1a0 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar153 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar153 = ZEXT3264(*(undefined1 (*) [32])(lVar60 + local_1a0 * 0x20));
                }
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar41 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar55;
                        if ((((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                            (0 < (int)uVar10)) && (iVar42 < iVar46)) {
                          lVar51 = (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar61 = uVar57;
                          uVar58 = (ulong)uVar10;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar42 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar42 < iVar65)) {
                              lVar49 = (long)(iVar42 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51);
                              auVar207._4_4_ = uVar1;
                              auVar207._0_4_ = uVar1;
                              auVar207._8_4_ = uVar1;
                              auVar207._12_4_ = uVar1;
                              auVar207._16_4_ = uVar1;
                              auVar207._20_4_ = uVar1;
                              auVar207._24_4_ = uVar1;
                              auVar207._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 4);
                              auVar247._4_4_ = uVar1;
                              auVar247._0_4_ = uVar1;
                              auVar247._8_4_ = uVar1;
                              auVar247._12_4_ = uVar1;
                              auVar247._16_4_ = uVar1;
                              auVar247._20_4_ = uVar1;
                              auVar247._24_4_ = uVar1;
                              auVar247._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 8);
                              auVar335._4_4_ = uVar1;
                              auVar335._0_4_ = uVar1;
                              auVar335._8_4_ = uVar1;
                              auVar335._12_4_ = uVar1;
                              auVar335._16_4_ = uVar1;
                              auVar335._20_4_ = uVar1;
                              auVar335._24_4_ = uVar1;
                              auVar335._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0xc);
                              auVar413._4_4_ = uVar1;
                              auVar413._0_4_ = uVar1;
                              auVar413._8_4_ = uVar1;
                              auVar413._12_4_ = uVar1;
                              auVar413._16_4_ = uVar1;
                              auVar413._20_4_ = uVar1;
                              auVar413._24_4_ = uVar1;
                              auVar413._28_4_ = uVar1;
                              uVar50 = uVar61 & 0xffffffff;
                              auVar230 = vfmadd231ps_fma(auVar153._0_32_,auVar207,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar50 * 4));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar247,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x20));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar335,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x40));
                              auVar230 = vfmadd231ps_fma(ZEXT1632(auVar230),auVar413,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x60));
                              auVar153 = ZEXT1664(auVar230);
                            }
                            uVar61 = uVar61 + 0x20;
                            iVar41 = iVar41 + iVar54;
                            uVar58 = uVar58 - 1;
                          } while (uVar58 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 0x20;
                      } while (uVar66 != uVar11);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar147 = auVar153._0_32_;
                auVar141 = auVar387._0_32_;
                auVar219 = auVar458._0_32_;
                auVar455 = auVar340._0_32_;
                auVar143 = auVar395._0_32_;
                auVar137 = auVar152._0_32_;
                auVar452._28_36_ = auVar153._28_36_;
                fVar69 = auVar387._0_4_;
                fVar68 = auVar387._4_4_;
                fVar485 = auVar387._8_4_;
                fVar228 = auVar387._12_4_;
                fVar229 = auVar387._16_4_;
                fVar25 = auVar387._20_4_;
                fVar154 = auVar387._24_4_;
                fVar26 = auVar387._28_4_;
                switch(uVar12) {
                case 1:
                  auVar147 = vmaxps_avx(auVar147,_DAT_005516a0);
                  break;
                case 2:
                  auVar455 = vmaxps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar147 = vminps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar146._4_4_ = uVar1;
                  auVar146._0_4_ = uVar1;
                  auVar146._8_4_ = uVar1;
                  auVar146._12_4_ = uVar1;
                  auVar146._16_4_ = uVar1;
                  auVar146._20_4_ = uVar1;
                  auVar146._24_4_ = uVar1;
                  auVar146._28_4_ = uVar1;
                  auVar230 = vfmadd213ps_fma(auVar146,auVar147,auVar455);
                  auVar147 = ZEXT1632(auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar215._4_4_ = uVar1;
                  auVar215._0_4_ = uVar1;
                  auVar215._8_4_ = uVar1;
                  auVar215._12_4_ = uVar1;
                  auVar215._16_4_ = uVar1;
                  auVar215._20_4_ = uVar1;
                  auVar215._24_4_ = uVar1;
                  auVar215._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar480._4_4_ = uVar1;
                  auVar480._0_4_ = uVar1;
                  auVar480._8_4_ = uVar1;
                  auVar480._12_4_ = uVar1;
                  auVar480._16_4_ = uVar1;
                  auVar480._20_4_ = uVar1;
                  auVar480._24_4_ = uVar1;
                  auVar480._28_4_ = uVar1;
                  auVar147 = vmaxps_avx(auVar147,auVar215);
                  auVar147 = vminps_avx(auVar480,auVar147);
                  break;
                case 4:
                  auVar142._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
                  auVar142._8_4_ = -auVar153._8_4_;
                  auVar142._12_4_ = -auVar153._12_4_;
                  auVar142._16_4_ = -auVar153._16_4_;
                  auVar142._20_4_ = -auVar153._20_4_;
                  auVar142._24_4_ = -auVar153._24_4_;
                  auVar142._28_4_ = auVar153._28_4_ ^ 0x80000000;
                  auVar96._8_4_ = 0x42b0c0a5;
                  auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar96._12_4_ = 0x42b0c0a5;
                  auVar96._16_4_ = 0x42b0c0a5;
                  auVar96._20_4_ = 0x42b0c0a5;
                  auVar96._24_4_ = 0x42b0c0a5;
                  auVar96._28_4_ = 0x42b0c0a5;
                  auVar147 = vminps_avx(auVar142,auVar96);
                  auVar143 = vmaxps_avx(auVar143,auVar147);
                  auVar230 = vfmadd213ps_fma(auVar137,auVar143,auVar455);
                  auVar137 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar137,1);
                  auVar147 = vandps_avx(auVar147,auVar141);
                  auVar147 = vsubps_avx(auVar137,auVar147);
                  auVar97._8_4_ = 0x3f318000;
                  auVar97._0_8_ = 0x3f3180003f318000;
                  auVar97._12_4_ = 0x3f318000;
                  auVar97._16_4_ = 0x3f318000;
                  auVar97._20_4_ = 0x3f318000;
                  auVar97._24_4_ = 0x3f318000;
                  auVar97._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar143,auVar147,auVar97);
                  auVar252._8_4_ = 0x395e8083;
                  auVar252._0_8_ = 0x395e8083395e8083;
                  auVar252._12_4_ = 0x395e8083;
                  auVar252._16_4_ = 0x395e8083;
                  auVar252._20_4_ = 0x395e8083;
                  auVar252._24_4_ = 0x395e8083;
                  auVar252._28_4_ = 0x395e8083;
                  auVar396 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar252);
                  auVar143 = ZEXT1632(auVar396);
                  auVar34._28_4_ = auVar137._28_4_;
                  auVar34._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar98._8_4_ = 0x3ab743ce;
                  auVar98._0_8_ = 0x3ab743ce3ab743ce;
                  auVar98._12_4_ = 0x3ab743ce;
                  auVar98._16_4_ = 0x3ab743ce;
                  auVar98._20_4_ = 0x3ab743ce;
                  auVar98._24_4_ = 0x3ab743ce;
                  auVar98._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar219,auVar143,auVar98);
                  auVar253._8_4_ = 0x3c088908;
                  auVar253._0_8_ = 0x3c0889083c088908;
                  auVar253._12_4_ = 0x3c088908;
                  auVar253._16_4_ = 0x3c088908;
                  auVar253._20_4_ = 0x3c088908;
                  auVar253._24_4_ = 0x3c088908;
                  auVar253._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar253);
                  auVar254._8_4_ = 0x3d2aa9c1;
                  auVar254._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar254._12_4_ = 0x3d2aa9c1;
                  auVar254._16_4_ = 0x3d2aa9c1;
                  auVar254._20_4_ = 0x3d2aa9c1;
                  auVar254._24_4_ = 0x3d2aa9c1;
                  auVar254._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar254);
                  auVar99._8_4_ = 0x3e2aaaaa;
                  auVar99._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar99._12_4_ = 0x3e2aaaaa;
                  auVar99._16_4_ = 0x3e2aaaaa;
                  auVar99._20_4_ = 0x3e2aaaaa;
                  auVar99._24_4_ = 0x3e2aaaaa;
                  auVar99._28_4_ = 0x3e2aaaaa;
                  auVar143 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar99);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar455);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar34,auVar143);
                  auVar112._0_4_ = (int)auVar147._0_4_;
                  auVar112._4_4_ = (int)auVar147._4_4_;
                  auVar112._8_4_ = (int)auVar147._8_4_;
                  auVar112._12_4_ = (int)auVar147._12_4_;
                  auVar144._16_4_ = (int)auVar147._16_4_;
                  auVar144._0_16_ = auVar112;
                  auVar144._20_4_ = (int)auVar147._20_4_;
                  auVar144._24_4_ = (int)auVar147._24_4_;
                  auVar144._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar112,0x17);
                  auVar230 = vpslld_avx(auVar144._16_16_,0x17);
                  auVar72._8_4_ = 0x3f800000;
                  auVar72._0_8_ = 0x3f8000003f800000;
                  auVar72._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar72);
                  auVar396 = vpaddd_avx(auVar396,auVar72);
                  auVar145._16_16_ = auVar230;
                  auVar145._0_16_ = auVar396;
                  auVar216._0_4_ = auVar349._0_4_ + fVar69;
                  auVar216._4_4_ = auVar349._4_4_ + fVar68;
                  auVar216._8_4_ = auVar349._8_4_ + fVar485;
                  auVar216._12_4_ = auVar349._12_4_ + fVar228;
                  auVar216._16_4_ = fVar229 + 0.0;
                  auVar216._20_4_ = fVar25 + 0.0;
                  auVar216._24_4_ = fVar154 + 0.0;
                  auVar216._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar145,auVar216,auVar141);
                  auVar147 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar147,auVar141);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar147,auVar147);
                  auVar147 = ZEXT1632(auVar230);
                  break;
                case 5:
                  auVar435._8_4_ = 0x42b0c0a5;
                  auVar435._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar435._12_4_ = 0x42b0c0a5;
                  auVar435._16_4_ = 0x42b0c0a5;
                  auVar435._20_4_ = 0x42b0c0a5;
                  auVar435._24_4_ = 0x42b0c0a5;
                  auVar435._28_4_ = 0x42b0c0a5;
                  auVar147 = vminps_avx(auVar435,auVar147);
                  auVar208 = vmaxps_avx(auVar143,auVar147);
                  auVar230 = vfmadd213ps_fma(auVar137,auVar208,auVar455);
                  auVar444 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar444,1);
                  auVar147 = vandps_avx(auVar147,auVar141);
                  auVar147 = vsubps_avx(auVar444,auVar147);
                  auVar344._8_4_ = 0x3f318000;
                  auVar344._0_8_ = 0x3f3180003f318000;
                  auVar344._12_4_ = 0x3f318000;
                  auVar344._16_4_ = 0x3f318000;
                  auVar344._20_4_ = 0x3f318000;
                  auVar344._24_4_ = 0x3f318000;
                  auVar344._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar208,auVar147,auVar344);
                  auVar93._8_4_ = 0xb95e8083;
                  auVar93._0_8_ = 0xb95e8083b95e8083;
                  auVar93._12_4_ = 0xb95e8083;
                  auVar93._16_4_ = 0xb95e8083;
                  auVar93._20_4_ = 0xb95e8083;
                  auVar93._24_4_ = 0xb95e8083;
                  auVar93._28_4_ = 0xb95e8083;
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar93);
                  auVar208 = ZEXT1632(auVar396);
                  auVar31._28_4_ = auVar444._28_4_;
                  auVar31._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar456._8_4_ = 0x3ab743ce;
                  auVar456._0_8_ = 0x3ab743ce3ab743ce;
                  auVar456._12_4_ = 0x3ab743ce;
                  auVar456._16_4_ = 0x3ab743ce;
                  auVar456._20_4_ = 0x3ab743ce;
                  auVar456._24_4_ = 0x3ab743ce;
                  auVar456._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar219,auVar208,auVar456);
                  auVar367._8_4_ = 0x3c088908;
                  auVar367._0_8_ = 0x3c0889083c088908;
                  auVar367._12_4_ = 0x3c088908;
                  auVar367._16_4_ = 0x3c088908;
                  auVar367._20_4_ = 0x3c088908;
                  auVar367._24_4_ = 0x3c088908;
                  auVar367._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar208,auVar367);
                  auVar318._8_4_ = 0x3d2aa9c1;
                  auVar318._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar318._12_4_ = 0x3d2aa9c1;
                  auVar318._16_4_ = 0x3d2aa9c1;
                  auVar318._20_4_ = 0x3d2aa9c1;
                  auVar318._24_4_ = 0x3d2aa9c1;
                  auVar318._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar208,auVar318);
                  auVar319._8_4_ = 0x3e2aaaaa;
                  auVar319._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar319._12_4_ = 0x3e2aaaaa;
                  auVar319._16_4_ = 0x3e2aaaaa;
                  auVar319._20_4_ = 0x3e2aaaaa;
                  auVar319._24_4_ = 0x3e2aaaaa;
                  auVar319._28_4_ = 0x3e2aaaaa;
                  auVar208 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar208,auVar319);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar208,auVar455);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar31,auVar208);
                  auVar209._0_4_ = auVar230._0_4_ + fVar69;
                  auVar209._4_4_ = auVar230._4_4_ + fVar68;
                  auVar209._8_4_ = auVar230._8_4_ + fVar485;
                  auVar209._12_4_ = auVar230._12_4_ + fVar228;
                  auVar209._16_4_ = fVar229 + 0.0;
                  auVar209._20_4_ = fVar25 + 0.0;
                  auVar209._24_4_ = fVar154 + 0.0;
                  auVar209._28_4_ = fVar26 + 0.0;
                  auVar349._0_4_ = (int)auVar147._0_4_;
                  auVar349._4_4_ = (int)auVar147._4_4_;
                  auVar349._8_4_ = (int)auVar147._8_4_;
                  auVar349._12_4_ = (int)auVar147._12_4_;
                  auVar248._16_4_ = (int)auVar147._16_4_;
                  auVar248._0_16_ = auVar349;
                  auVar248._20_4_ = (int)auVar147._20_4_;
                  auVar248._24_4_ = (int)auVar147._24_4_;
                  auVar248._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar349,0x17);
                  auVar230 = vpslld_avx(auVar248._16_16_,0x17);
                  auVar346._8_4_ = 0x3f800000;
                  auVar346._0_8_ = 0x3f8000003f800000;
                  auVar346._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar346,auVar230);
                  auVar396 = vpaddd_avx(auVar396,auVar346);
                  auVar479._16_16_ = auVar230;
                  auVar479._0_16_ = auVar396;
                  auVar349 = vfmadd213ps_fma(auVar479,auVar209,auVar141);
                  auVar210._8_4_ = 0x800000;
                  auVar210._0_8_ = 0x80000000800000;
                  auVar210._12_4_ = 0x800000;
                  auVar210._16_4_ = 0x800000;
                  auVar210._20_4_ = 0x800000;
                  auVar210._24_4_ = 0x800000;
                  auVar210._28_4_ = 0x800000;
                  auVar147 = vmaxps_avx(ZEXT1632(auVar349),auVar210);
                  auVar396 = vpsrld_avx(auVar147._0_16_,0x17);
                  auVar230 = vpsrld_avx(auVar147._16_16_,0x17);
                  auVar320._8_4_ = 0x807fffff;
                  auVar320._0_8_ = 0x807fffff807fffff;
                  auVar320._12_4_ = 0x807fffff;
                  auVar320._16_4_ = 0x807fffff;
                  auVar320._20_4_ = 0x807fffff;
                  auVar320._24_4_ = 0x807fffff;
                  auVar320._28_4_ = 0x807fffff;
                  auVar147 = vandps_avx(auVar147,auVar320);
                  auVar444 = vorps_avx(auVar147,auVar455);
                  auVar321._8_4_ = 0x3f3504f3;
                  auVar321._0_8_ = 0x3f3504f33f3504f3;
                  auVar321._12_4_ = 0x3f3504f3;
                  auVar321._16_4_ = 0x3f3504f3;
                  auVar321._20_4_ = 0x3f3504f3;
                  auVar321._24_4_ = 0x3f3504f3;
                  auVar321._28_4_ = 0x3f3504f3;
                  auVar208 = vcmpps_avx(auVar321,auVar444,2);
                  auVar147 = vandnps_avx(auVar208,auVar444);
                  auVar211._0_4_ = auVar147._0_4_ + auVar444._0_4_ + -1.0;
                  auVar211._4_4_ = auVar147._4_4_ + auVar444._4_4_ + -1.0;
                  auVar211._8_4_ = auVar147._8_4_ + auVar444._8_4_ + -1.0;
                  auVar211._12_4_ = auVar147._12_4_ + auVar444._12_4_ + -1.0;
                  auVar211._16_4_ = auVar147._16_4_ + auVar444._16_4_ + -1.0;
                  auVar211._20_4_ = auVar147._20_4_ + auVar444._20_4_ + -1.0;
                  auVar211._24_4_ = auVar147._24_4_ + auVar444._24_4_ + -1.0;
                  auVar211._28_4_ = auVar147._28_4_ + auVar444._28_4_ + -1.0;
                  auVar230 = vpsubd_avx(auVar230,auVar208._16_16_);
                  auVar419._8_4_ = 0xffffff81;
                  auVar419._0_8_ = 0xffffff81ffffff81;
                  auVar419._12_4_ = 0xffffff81;
                  auVar230 = vpaddd_avx(auVar230,auVar419);
                  auVar396 = vpsubd_avx(auVar396,auVar208._0_16_);
                  auVar396 = vpaddd_avx(auVar419,auVar396);
                  auVar249._16_16_ = auVar230;
                  auVar249._0_16_ = auVar396;
                  auVar32._4_4_ = auVar211._4_4_ * auVar211._4_4_;
                  auVar32._0_4_ = auVar211._0_4_ * auVar211._0_4_;
                  auVar32._8_4_ = auVar211._8_4_ * auVar211._8_4_;
                  auVar32._12_4_ = auVar211._12_4_ * auVar211._12_4_;
                  auVar32._16_4_ = auVar211._16_4_ * auVar211._16_4_;
                  auVar32._20_4_ = auVar211._20_4_ * auVar211._20_4_;
                  auVar32._24_4_ = auVar211._24_4_ * auVar211._24_4_;
                  auVar32._28_4_ = auVar208._28_4_;
                  auVar414._8_4_ = 0x3d9021bb;
                  auVar414._0_8_ = 0x3d9021bb3d9021bb;
                  auVar414._12_4_ = 0x3d9021bb;
                  auVar414._16_4_ = 0x3d9021bb;
                  auVar414._20_4_ = 0x3d9021bb;
                  auVar414._24_4_ = 0x3d9021bb;
                  auVar414._28_4_ = 0x3d9021bb;
                  auVar368._8_4_ = 0xbdebd1b8;
                  auVar368._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar368._12_4_ = 0xbdebd1b8;
                  auVar368._16_4_ = 0xbdebd1b8;
                  auVar368._20_4_ = 0xbdebd1b8;
                  auVar368._24_4_ = 0xbdebd1b8;
                  auVar368._28_4_ = 0xbdebd1b8;
                  auVar230 = vfmadd213ps_fma(auVar414,auVar211,auVar368);
                  auVar369._8_4_ = 0x3def251a;
                  auVar369._0_8_ = 0x3def251a3def251a;
                  auVar369._12_4_ = 0x3def251a;
                  auVar369._16_4_ = 0x3def251a;
                  auVar369._20_4_ = 0x3def251a;
                  auVar369._24_4_ = 0x3def251a;
                  auVar369._28_4_ = 0x3def251a;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar369);
                  auVar370._8_4_ = 0xbdfe5d4f;
                  auVar370._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar370._12_4_ = 0xbdfe5d4f;
                  auVar370._16_4_ = 0xbdfe5d4f;
                  auVar370._20_4_ = 0xbdfe5d4f;
                  auVar370._24_4_ = 0xbdfe5d4f;
                  auVar370._28_4_ = 0xbdfe5d4f;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar370);
                  auVar371._8_4_ = 0x3e11e9bf;
                  auVar371._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar371._12_4_ = 0x3e11e9bf;
                  auVar371._16_4_ = 0x3e11e9bf;
                  auVar371._20_4_ = 0x3e11e9bf;
                  auVar371._24_4_ = 0x3e11e9bf;
                  auVar371._28_4_ = 0x3e11e9bf;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar371);
                  auVar372._8_4_ = 0xbe2aae50;
                  auVar372._0_8_ = 0xbe2aae50be2aae50;
                  auVar372._12_4_ = 0xbe2aae50;
                  auVar372._16_4_ = 0xbe2aae50;
                  auVar372._20_4_ = 0xbe2aae50;
                  auVar372._24_4_ = 0xbe2aae50;
                  auVar372._28_4_ = 0xbe2aae50;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar372);
                  auVar373._8_4_ = 0x3e4cceac;
                  auVar373._0_8_ = 0x3e4cceac3e4cceac;
                  auVar373._12_4_ = 0x3e4cceac;
                  auVar373._16_4_ = 0x3e4cceac;
                  auVar373._20_4_ = 0x3e4cceac;
                  auVar373._24_4_ = 0x3e4cceac;
                  auVar373._28_4_ = 0x3e4cceac;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar373);
                  auVar374._8_4_ = 0xbe7ffffc;
                  auVar374._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar374._12_4_ = 0xbe7ffffc;
                  auVar374._16_4_ = 0xbe7ffffc;
                  auVar374._20_4_ = 0xbe7ffffc;
                  auVar374._24_4_ = 0xbe7ffffc;
                  auVar374._28_4_ = 0xbe7ffffc;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar374);
                  auVar375._8_4_ = 0x3eaaaaaa;
                  auVar375._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar375._12_4_ = 0x3eaaaaaa;
                  auVar375._16_4_ = 0x3eaaaaaa;
                  auVar375._20_4_ = 0x3eaaaaaa;
                  auVar375._24_4_ = 0x3eaaaaaa;
                  auVar375._28_4_ = 0x3eaaaaaa;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar211,auVar375);
                  auVar415._0_4_ = auVar211._0_4_ * auVar211._0_4_ * auVar211._0_4_ * auVar230._0_4_
                  ;
                  auVar415._4_4_ = auVar211._4_4_ * auVar211._4_4_ * auVar211._4_4_ * auVar230._4_4_
                  ;
                  auVar415._8_4_ = auVar211._8_4_ * auVar211._8_4_ * auVar211._8_4_ * auVar230._8_4_
                  ;
                  auVar415._12_4_ =
                       auVar211._12_4_ * auVar211._12_4_ * auVar211._12_4_ * auVar230._12_4_;
                  auVar415._16_4_ = auVar211._16_4_ * auVar211._16_4_ * auVar211._16_4_ * 0.0;
                  auVar415._20_4_ = auVar211._20_4_ * auVar211._20_4_ * auVar211._20_4_ * 0.0;
                  auVar415._24_4_ = auVar211._24_4_ * auVar211._24_4_ * auVar211._24_4_ * 0.0;
                  auVar415._28_4_ = 0;
                  auVar208 = vcvtdq2ps_avx(auVar249);
                  auVar436._8_4_ = 0xb95e8083;
                  auVar436._0_8_ = 0xb95e8083b95e8083;
                  auVar436._12_4_ = 0xb95e8083;
                  auVar436._16_4_ = 0xb95e8083;
                  auVar436._20_4_ = 0xb95e8083;
                  auVar436._24_4_ = 0xb95e8083;
                  auVar436._28_4_ = 0xb95e8083;
                  auVar230 = vfmadd231ps_fma(auVar415,auVar208,auVar436);
                  auVar230 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar455,auVar32);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar349),ZEXT832(0) << 0x20,2);
                  auVar444 = vsubps_avx(ZEXT1632(auVar230),auVar211);
                  auVar230 = vfmsub231ps_fma(auVar444,auVar344,auVar208);
                  auVar376._8_4_ = 0xc0000000;
                  auVar376._0_8_ = 0xc0000000c0000000;
                  auVar376._12_4_ = 0xc0000000;
                  auVar376._16_4_ = 0xc0000000;
                  auVar376._20_4_ = 0xc0000000;
                  auVar376._24_4_ = 0xc0000000;
                  auVar376._28_4_ = 0xc0000000;
                  auVar212._0_4_ = auVar230._0_4_ * -2.0;
                  auVar212._4_4_ = auVar230._4_4_ * -2.0;
                  auVar212._8_4_ = auVar230._8_4_ * -2.0;
                  auVar212._12_4_ = auVar230._12_4_ * -2.0;
                  auVar212._16_4_ = 0x80000000;
                  auVar212._20_4_ = 0x80000000;
                  auVar212._24_4_ = 0x80000000;
                  auVar212._28_4_ = 0;
                  auVar250._8_4_ = 0x7fffffff;
                  auVar250._0_8_ = 0x7fffffff7fffffff;
                  auVar250._12_4_ = 0x7fffffff;
                  auVar250._16_4_ = 0x7fffffff;
                  auVar250._20_4_ = 0x7fffffff;
                  auVar250._24_4_ = 0x7fffffff;
                  auVar250._28_4_ = 0x7fffffff;
                  auVar147 = vblendvps_avx(auVar212,auVar250,auVar147);
                  auVar147 = vminps_avx(auVar435,auVar147);
                  auVar395 = ZEXT3264(auVar143);
                  auVar143 = vmaxps_avx(auVar143,auVar147);
                  auVar152 = ZEXT3264(auVar137);
                  auVar230 = vfmadd213ps_fma(auVar137,auVar143,auVar455);
                  auVar137 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar137,1);
                  auVar147 = vandps_avx(auVar147,auVar141);
                  auVar147 = vsubps_avx(auVar137,auVar147);
                  auVar230 = vfmsub231ps_fma(auVar143,auVar147,auVar344);
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar436);
                  auVar143 = ZEXT1632(auVar396);
                  auVar33._28_4_ = auVar137._28_4_;
                  auVar33._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar458 = ZEXT3264(auVar219);
                  auVar230 = vfmadd213ps_fma(auVar219,auVar143,auVar456);
                  auVar322._8_4_ = 0x3c088908;
                  auVar322._0_8_ = 0x3c0889083c088908;
                  auVar322._12_4_ = 0x3c088908;
                  auVar322._16_4_ = 0x3c088908;
                  auVar322._20_4_ = 0x3c088908;
                  auVar322._24_4_ = 0x3c088908;
                  auVar322._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar322);
                  auVar323._8_4_ = 0x3d2aa9c1;
                  auVar323._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar323._12_4_ = 0x3d2aa9c1;
                  auVar323._16_4_ = 0x3d2aa9c1;
                  auVar323._20_4_ = 0x3d2aa9c1;
                  auVar323._24_4_ = 0x3d2aa9c1;
                  auVar323._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar323);
                  auVar340 = ZEXT3264(auVar455);
                  auVar387 = ZEXT3264(auVar141);
                  auVar94._8_4_ = 0x3e2aaaaa;
                  auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar94._12_4_ = 0x3e2aaaaa;
                  auVar94._16_4_ = 0x3e2aaaaa;
                  auVar94._20_4_ = 0x3e2aaaaa;
                  auVar94._24_4_ = 0x3e2aaaaa;
                  auVar94._28_4_ = 0x3e2aaaaa;
                  auVar143 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar94);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar143,auVar455);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar33,auVar143);
                  auVar363._0_4_ = (int)auVar147._0_4_;
                  auVar363._4_4_ = (int)auVar147._4_4_;
                  auVar363._8_4_ = (int)auVar147._8_4_;
                  auVar363._12_4_ = (int)auVar147._12_4_;
                  auVar213._16_4_ = (int)auVar147._16_4_;
                  auVar213._0_16_ = auVar363;
                  auVar213._20_4_ = (int)auVar147._20_4_;
                  auVar213._24_4_ = (int)auVar147._24_4_;
                  auVar213._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar363,0x17);
                  auVar230 = vpslld_avx(auVar213._16_16_,0x17);
                  auVar71._8_4_ = 0x3f800000;
                  auVar71._0_8_ = 0x3f8000003f800000;
                  auVar71._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar71);
                  auVar396 = vpaddd_avx(auVar396,auVar71);
                  auVar214._16_16_ = auVar230;
                  auVar214._0_16_ = auVar396;
                  auVar251._0_4_ = auVar349._0_4_ + fVar69;
                  auVar251._4_4_ = auVar349._4_4_ + fVar68;
                  auVar251._8_4_ = auVar349._8_4_ + fVar485;
                  auVar251._12_4_ = auVar349._12_4_ + fVar228;
                  auVar251._16_4_ = fVar229 + 0.0;
                  auVar251._20_4_ = fVar25 + 0.0;
                  auVar251._24_4_ = fVar154 + 0.0;
                  auVar251._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar214,auVar251,auVar141);
                  auVar147 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar147,auVar141);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar147,auVar147);
                  auVar95._8_4_ = 0xbf800000;
                  auVar95._0_8_ = 0xbf800000bf800000;
                  auVar95._12_4_ = 0xbf800000;
                  auVar95._16_4_ = 0xbf800000;
                  auVar95._20_4_ = 0xbf800000;
                  auVar95._24_4_ = 0xbf800000;
                  auVar95._28_4_ = 0xbf800000;
                  auVar230 = vfnmadd213ps_fma(ZEXT1632(auVar230),auVar376,auVar95);
                  auVar194 = ZEXT1628(auVar230);
                  goto LAB_002ba3cd;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar217._4_4_ = uVar1;
                  auVar217._0_4_ = uVar1;
                  auVar217._8_4_ = uVar1;
                  auVar217._12_4_ = uVar1;
                  auVar217._16_4_ = uVar1;
                  auVar217._20_4_ = uVar1;
                  auVar217._24_4_ = uVar1;
                  auVar217._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar255._4_4_ = uVar1;
                  auVar255._0_4_ = uVar1;
                  auVar255._8_4_ = uVar1;
                  auVar255._12_4_ = uVar1;
                  auVar255._16_4_ = uVar1;
                  auVar255._20_4_ = uVar1;
                  auVar255._24_4_ = uVar1;
                  auVar255._28_4_ = uVar1;
                  auVar230 = vfmadd231ps_fma(auVar255,auVar147,auVar217);
                  auVar147 = vmaxps_avx(ZEXT1632(auVar230),_DAT_005516a0);
                  auVar147 = vminps_avx(auVar147,auVar141);
                  auVar194 = auVar147._0_28_;
LAB_002ba3cd:
                  auVar452._0_4_ = auVar194._0_4_ * auVar153._0_4_;
                  auVar452._4_4_ = auVar194._4_4_ * auVar153._4_4_;
                  auVar452._8_4_ = auVar194._8_4_ * auVar153._8_4_;
                  auVar452._12_4_ = auVar194._12_4_ * auVar153._12_4_;
                  auVar452._16_4_ = auVar194._16_4_ * auVar153._16_4_;
                  auVar452._20_4_ = auVar194._20_4_ * auVar153._20_4_;
                  auVar452._24_4_ = auVar194._24_4_ * auVar153._24_4_;
                  auVar147 = auVar452._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var56 = auVar147;
                ppp_Var56 = ppp_Var56 + 4;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar8 == 8) && (local_144 == 4)) && (0 < (long)local_c8.c)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_1a0 = 0;
      auVar387 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar325._8_4_ = 0x3f000000;
      auVar325._0_8_ = 0x3f0000003f000000;
      auVar325._12_4_ = 0x3f000000;
      auVar340 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar453._8_4_ = 0x3ab743ce;
      auVar453._0_8_ = 0x3ab743ce3ab743ce;
      auVar453._12_4_ = 0x3ab743ce;
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_1a0 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar113 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar113 = *(undefined1 (*) [16])(lVar60 + local_1a0 * 0x10);
                }
                auVar395 = ZEXT1664(auVar113);
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar41 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar55;
                        if ((((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                            (0 < (int)uVar10)) && (iVar42 < iVar46)) {
                          lVar51 = (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar61 = (ulong)uVar10;
                          uVar58 = uVar57;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar42 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar42 < iVar65)) {
                              lVar49 = (long)(iVar42 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51);
                              auVar155._4_4_ = uVar1;
                              auVar155._0_4_ = uVar1;
                              auVar155._8_4_ = uVar1;
                              auVar155._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 4);
                              auVar265._4_4_ = uVar1;
                              auVar265._0_4_ = uVar1;
                              auVar265._8_4_ = uVar1;
                              auVar265._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 8);
                              auVar347._4_4_ = uVar1;
                              auVar347._0_4_ = uVar1;
                              auVar347._8_4_ = uVar1;
                              auVar347._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0xc);
                              auVar388._4_4_ = uVar1;
                              auVar388._0_4_ = uVar1;
                              auVar388._8_4_ = uVar1;
                              auVar388._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x10);
                              auVar397._4_4_ = uVar1;
                              auVar397._0_4_ = uVar1;
                              auVar397._8_4_ = uVar1;
                              auVar397._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x14);
                              auVar460._4_4_ = uVar1;
                              auVar460._0_4_ = uVar1;
                              auVar460._8_4_ = uVar1;
                              auVar460._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x18);
                              auVar420._4_4_ = uVar1;
                              auVar420._0_4_ = uVar1;
                              auVar420._8_4_ = uVar1;
                              auVar420._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0x1c);
                              auVar439._4_4_ = uVar1;
                              auVar439._0_4_ = uVar1;
                              auVar439._8_4_ = uVar1;
                              auVar439._12_4_ = uVar1;
                              uVar50 = uVar58 & 0xffffffff;
                              auVar230 = vfmadd231ps_fma(auVar395._0_16_,auVar155,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar265,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x10));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar347,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x20));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar388,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x30));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar397,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x40));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar460,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x50));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar420,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x60));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar439,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x70));
                              auVar395 = ZEXT1664(auVar230);
                            }
                            uVar58 = uVar58 + 0x20;
                            iVar41 = iVar41 + iVar54;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 0x20;
                      } while (uVar66 != uVar11);
                    }
                    auVar113 = auVar395._0_16_;
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar396 = auVar387._0_16_;
                auVar230 = auVar340._0_16_;
                fVar69 = auVar340._0_4_;
                fVar68 = auVar340._4_4_;
                fVar485 = auVar340._8_4_;
                fVar228 = auVar340._12_4_;
                fVar154 = auVar113._4_4_;
                fVar229 = auVar113._8_4_;
                fVar25 = auVar113._12_4_;
                switch(uVar12) {
                case 1:
                  auVar113 = vmaxps_avx(auVar113,auVar396);
                  break;
                case 2:
                  auVar230 = vmaxps_avx(auVar113,auVar396);
                  auVar396 = vminps_avx(auVar113,auVar396);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar116._4_4_ = uVar1;
                  auVar116._0_4_ = uVar1;
                  auVar116._8_4_ = uVar1;
                  auVar116._12_4_ = uVar1;
                  auVar113 = vfmadd213ps_fma(auVar116,auVar396,auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar353._4_4_ = uVar1;
                  auVar353._0_4_ = uVar1;
                  auVar353._8_4_ = uVar1;
                  auVar353._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar463._4_4_ = uVar1;
                  auVar463._0_4_ = uVar1;
                  auVar463._8_4_ = uVar1;
                  auVar463._12_4_ = uVar1;
                  auVar230 = vmaxps_avx(auVar353,auVar113);
                  auVar113 = vminps_avx(auVar463,auVar230);
                  break;
                case 4:
                  auVar114._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                  auVar114._8_4_ = -fVar229;
                  auVar114._12_4_ = -fVar25;
                  auVar161._8_4_ = 0x42b0c0a5;
                  auVar161._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar161._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar114,auVar161);
                  auVar162._8_4_ = 0xc2b0c0a5;
                  auVar162._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar162._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar162);
                  auVar354._8_4_ = 0x3fb8aa3b;
                  auVar354._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar354._12_4_ = 0x3fb8aa3b;
                  auVar396 = vfmadd213ps_fma(auVar354,auVar127,auVar325);
                  auVar464._0_4_ = (int)auVar396._0_4_;
                  auVar464._4_4_ = (int)auVar396._4_4_;
                  auVar464._8_4_ = (int)auVar396._8_4_;
                  auVar464._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar464);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar74._8_4_ = 0x3f318000;
                  auVar74._0_8_ = 0x3f3180003f318000;
                  auVar74._12_4_ = 0x3f318000;
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar74);
                  auVar163._8_4_ = 0x395e8083;
                  auVar163._0_8_ = 0x395e8083395e8083;
                  auVar163._12_4_ = 0x395e8083;
                  auVar127 = vfmsub231ps_fma(auVar349,auVar396,auVar163);
                  auVar465._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar465._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar465._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar465._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar399._8_4_ = 0x39506967;
                  auVar399._0_8_ = 0x3950696739506967;
                  auVar399._12_4_ = 0x39506967;
                  auVar164._8_4_ = 0x3ab743ce;
                  auVar164._0_8_ = 0x3ab743ce3ab743ce;
                  auVar164._12_4_ = 0x3ab743ce;
                  auVar349 = vfmadd213ps_fma(auVar399,auVar127,auVar164);
                  auVar165._8_4_ = 0x3c088908;
                  auVar165._0_8_ = 0x3c0889083c088908;
                  auVar165._12_4_ = 0x3c088908;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar165);
                  auVar75._8_4_ = 0x3d2aa9c1;
                  auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar75._12_4_ = 0x3d2aa9c1;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar75);
                  auVar76._8_4_ = 0x3e2aaaaa;
                  auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar76._12_4_ = 0x3e2aaaaa;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar76);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar325);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar465,auVar127);
                  auVar400._0_4_ = auVar349._0_4_ + fVar69;
                  auVar400._4_4_ = auVar349._4_4_ + fVar68;
                  auVar400._8_4_ = auVar349._8_4_ + fVar485;
                  auVar400._12_4_ = auVar349._12_4_ + fVar228;
                  auVar115._0_4_ = (int)auVar396._0_4_;
                  auVar115._4_4_ = (int)auVar396._4_4_;
                  auVar115._8_4_ = (int)auVar396._8_4_;
                  auVar115._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar115,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar349 = vfmadd213ps_fma(auVar396,auVar400,auVar230);
                  auVar396 = vrcpps_avx(auVar349);
                  auVar230 = vfmsub213ps_fma(auVar349,auVar396,auVar230);
                  auVar113 = vfnmadd132ps_fma(auVar230,auVar396,auVar396);
                  break;
                case 5:
                  auVar421._8_4_ = 0x42b0c0a5;
                  auVar421._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar421._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar421,auVar113);
                  auVar440._8_4_ = 0xc2b0c0a5;
                  auVar440._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar440._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar440);
                  auVar447._8_4_ = 0x3fb8aa3b;
                  auVar447._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar447._12_4_ = 0x3fb8aa3b;
                  auVar396 = vfmadd213ps_fma(auVar447,auVar127,auVar325);
                  auVar461._0_4_ = (int)auVar396._0_4_;
                  auVar461._4_4_ = (int)auVar396._4_4_;
                  auVar461._8_4_ = (int)auVar396._8_4_;
                  auVar461._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar461);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar422._8_4_ = 0x3f318000;
                  auVar422._0_8_ = 0x3f3180003f318000;
                  auVar422._12_4_ = 0x3f318000;
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar422);
                  auVar441._8_4_ = 0xb95e8083;
                  auVar441._0_8_ = 0xb95e8083b95e8083;
                  auVar441._12_4_ = 0xb95e8083;
                  auVar127 = vfnmsub231ps_fma(auVar349,auVar396,auVar441);
                  auVar462._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar462._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar462._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar462._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar341._8_4_ = 0x39506967;
                  auVar341._0_8_ = 0x3950696739506967;
                  auVar341._12_4_ = 0x39506967;
                  auVar349 = vfmadd213ps_fma(auVar341,auVar127,auVar453);
                  auVar231._8_4_ = 0x3c088908;
                  auVar231._0_8_ = 0x3c0889083c088908;
                  auVar231._12_4_ = 0x3c088908;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar231);
                  auVar336._8_4_ = 0x3d2aa9c1;
                  auVar336._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar336._12_4_ = 0x3d2aa9c1;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar336);
                  auVar232._8_4_ = 0x3e2aaaaa;
                  auVar232._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar232._12_4_ = 0x3e2aaaaa;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar232);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar325);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar462,auVar127);
                  auVar156._0_4_ = auVar349._0_4_ + fVar69;
                  auVar156._4_4_ = auVar349._4_4_ + fVar68;
                  auVar156._8_4_ = auVar349._8_4_ + fVar485;
                  auVar156._12_4_ = auVar349._12_4_ + fVar228;
                  auVar348._0_4_ = (int)auVar396._0_4_;
                  auVar348._4_4_ = (int)auVar396._4_4_;
                  auVar348._8_4_ = (int)auVar396._8_4_;
                  auVar348._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar348,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar70 = vfmadd213ps_fma(auVar396,auVar156,auVar230);
                  auVar157._8_4_ = 0x800000;
                  auVar157._0_8_ = 0x80000000800000;
                  auVar157._12_4_ = 0x800000;
                  auVar396 = vmaxps_avx(auVar70,auVar157);
                  auVar349 = vpsrld_avx(auVar396,0x17);
                  auVar266._8_4_ = 0xffffff82;
                  auVar266._0_8_ = 0xffffff82ffffff82;
                  auVar266._12_4_ = 0xffffff82;
                  auVar349 = vpaddd_avx(auVar349,auVar266);
                  auVar267._8_4_ = 0x807fffff;
                  auVar267._0_8_ = 0x807fffff807fffff;
                  auVar267._12_4_ = 0x807fffff;
                  auVar396 = vandps_avx(auVar396,auVar267);
                  auVar418 = vorps_avx(auVar396,auVar325);
                  auVar127 = vcvtdq2ps_avx(auVar349);
                  auVar268._8_4_ = 0x3f3504f3;
                  auVar268._0_8_ = 0x3f3504f33f3504f3;
                  auVar268._12_4_ = 0x3f3504f3;
                  auVar349 = vcmpps_avx(auVar418,auVar268,1);
                  auVar396 = vandps_avx(auVar349,auVar418);
                  auVar158._0_4_ = auVar396._0_4_ + auVar418._0_4_ + -1.0;
                  auVar158._4_4_ = auVar396._4_4_ + auVar418._4_4_ + -1.0;
                  auVar158._8_4_ = auVar396._8_4_ + auVar418._8_4_ + -1.0;
                  auVar158._12_4_ = auVar396._12_4_ + auVar418._12_4_ + -1.0;
                  auVar396 = vandps_avx(auVar349,auVar230);
                  auVar349 = vsubps_avx(auVar127,auVar396);
                  auVar389._0_4_ = auVar158._0_4_ * auVar158._0_4_;
                  auVar389._4_4_ = auVar158._4_4_ * auVar158._4_4_;
                  auVar389._8_4_ = auVar158._8_4_ * auVar158._8_4_;
                  auVar389._12_4_ = auVar158._12_4_ * auVar158._12_4_;
                  auVar398._8_4_ = 0x3d9021bb;
                  auVar398._0_8_ = 0x3d9021bb3d9021bb;
                  auVar398._12_4_ = 0x3d9021bb;
                  auVar269._8_4_ = 0xbdebd1b8;
                  auVar269._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar269._12_4_ = 0xbdebd1b8;
                  auVar396 = vfmadd213ps_fma(auVar398,auVar158,auVar269);
                  auVar270._8_4_ = 0x3def251a;
                  auVar270._0_8_ = 0x3def251a3def251a;
                  auVar270._12_4_ = 0x3def251a;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar270);
                  auVar271._8_4_ = 0xbdfe5d4f;
                  auVar271._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar271._12_4_ = 0xbdfe5d4f;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar271);
                  auVar272._8_4_ = 0x3e11e9bf;
                  auVar272._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar272._12_4_ = 0x3e11e9bf;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar272);
                  auVar273._8_4_ = 0xbe2aae50;
                  auVar273._0_8_ = 0xbe2aae50be2aae50;
                  auVar273._12_4_ = 0xbe2aae50;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar273);
                  auVar274._8_4_ = 0x3e4cceac;
                  auVar274._0_8_ = 0x3e4cceac3e4cceac;
                  auVar274._12_4_ = 0x3e4cceac;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar274);
                  auVar275._8_4_ = 0xbe7ffffc;
                  auVar275._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar275._12_4_ = 0xbe7ffffc;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar275);
                  auVar276._8_4_ = 0x3eaaaaaa;
                  auVar276._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar276._12_4_ = 0x3eaaaaaa;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar158,auVar276);
                  auVar277._0_4_ = auVar396._0_4_ * auVar389._0_4_ * auVar158._0_4_;
                  auVar277._4_4_ = auVar396._4_4_ * auVar389._4_4_ * auVar158._4_4_;
                  auVar277._8_4_ = auVar396._8_4_ * auVar389._8_4_ * auVar158._8_4_;
                  auVar277._12_4_ = auVar396._12_4_ * auVar389._12_4_ * auVar158._12_4_;
                  auVar396 = vfmadd231ps_fma(auVar277,auVar349,auVar441);
                  auVar127 = vfmsub231ps_fma(auVar396,auVar325,auVar389);
                  auVar396 = vcmpps_avx(auVar70,_DAT_0054c0d0,2);
                  auVar127 = vsubps_avx(auVar127,auVar158);
                  auVar349 = vfnmadd231ps_fma(auVar127,auVar422,auVar349);
                  auVar159._0_4_ = auVar349._0_4_ + auVar349._0_4_;
                  auVar159._4_4_ = auVar349._4_4_ + auVar349._4_4_;
                  auVar159._8_4_ = auVar349._8_4_ + auVar349._8_4_;
                  auVar159._12_4_ = auVar349._12_4_ + auVar349._12_4_;
                  auVar278._8_4_ = 0x7fffffff;
                  auVar278._0_8_ = 0x7fffffff7fffffff;
                  auVar278._12_4_ = 0x7fffffff;
                  auVar396 = vblendvps_avx(auVar159,auVar278,auVar396);
                  auVar279._8_4_ = 0x42b0c0a5;
                  auVar279._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar279._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar396,auVar279);
                  auVar280._8_4_ = 0xc2b0c0a5;
                  auVar280._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar280._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar280);
                  auVar396 = vfmadd213ps_fma(auVar447,auVar127,auVar325);
                  auVar350._0_4_ = (int)auVar396._0_4_;
                  auVar350._4_4_ = (int)auVar396._4_4_;
                  auVar350._8_4_ = (int)auVar396._8_4_;
                  auVar350._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar350);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar422);
                  auVar127 = vfnmsub231ps_fma(auVar349,auVar396,auVar441);
                  auVar351._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar351._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar351._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar351._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar349 = vfmadd213ps_fma(auVar341,auVar127,auVar453);
                  auVar342._8_4_ = 0x3c088908;
                  auVar342._0_8_ = 0x3c0889083c088908;
                  auVar342._12_4_ = 0x3c088908;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar342);
                  auVar387 = ZEXT864(0);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar336);
                  auVar340 = ZEXT1664(auVar230);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar232);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar325);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar351,auVar127);
                  auVar160._0_4_ = auVar349._0_4_ + fVar69;
                  auVar160._4_4_ = auVar349._4_4_ + fVar68;
                  auVar160._8_4_ = auVar349._8_4_ + fVar485;
                  auVar160._12_4_ = auVar349._12_4_ + fVar228;
                  auVar281._0_4_ = (int)auVar396._0_4_;
                  auVar281._4_4_ = (int)auVar396._4_4_;
                  auVar281._8_4_ = (int)auVar396._8_4_;
                  auVar281._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar281,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar396 = vfmadd213ps_fma(auVar396,auVar160,auVar230);
                  auVar230 = vrcpps_avx(auVar396);
                  auVar352._0_4_ = auVar230._0_4_ + auVar230._0_4_;
                  auVar352._4_4_ = auVar230._4_4_ + auVar230._4_4_;
                  auVar352._8_4_ = auVar230._8_4_ + auVar230._8_4_;
                  auVar352._12_4_ = auVar230._12_4_ + auVar230._12_4_;
                  auVar73._8_4_ = 0x40000000;
                  auVar73._0_8_ = 0x4000000040000000;
                  auVar73._12_4_ = 0x40000000;
                  auVar396 = vfmsub213ps_fma(auVar396,auVar352,auVar73);
                  auVar230 = vfnmadd213ps_fma(auVar396,auVar230,auVar352);
                  auVar113 = vfmsub231ps_fma(auVar113,auVar113,auVar230);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar166._4_4_ = uVar1;
                  auVar166._0_4_ = uVar1;
                  auVar166._8_4_ = uVar1;
                  auVar166._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar282._4_4_ = uVar1;
                  auVar282._0_4_ = uVar1;
                  auVar282._8_4_ = uVar1;
                  auVar282._12_4_ = uVar1;
                  auVar349 = vfmadd231ps_fma(auVar282,auVar113,auVar166);
                  auVar396 = vmaxps_avx(auVar349,auVar396);
                  auVar230 = vminps_avx(auVar396,auVar230);
                  auVar113._0_4_ = auVar230._0_4_ * auVar113._0_4_;
                  auVar113._4_4_ = auVar230._4_4_ * fVar154;
                  auVar113._8_4_ = auVar230._8_4_ * fVar229;
                  auVar113._12_4_ = auVar230._12_4_ * fVar25;
                }
                *(undefined1 (*) [16])ppp_Var56 = auVar113;
                ppp_Var56 = ppp_Var56 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar8 == 1) && (local_144 == 8)) && (0 < (long)local_c8.c)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_1a0 = 0;
      auVar387 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar339._8_4_ = 0x3f000000;
      auVar339._0_8_ = 0x3f0000003f000000;
      auVar339._12_4_ = 0x3f000000;
      auVar339._16_4_ = 0x3f000000;
      auVar339._20_4_ = 0x3f000000;
      auVar339._24_4_ = 0x3f000000;
      auVar339._28_4_ = 0x3f000000;
      auVar395 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar340 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar152 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_1a0 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar458 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar458 = ZEXT3264(*(undefined1 (*) [32])(lVar60 + local_1a0 * 0x20));
                }
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar41 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar55;
                        if ((((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                            (iVar42 < iVar46)) && (0 < (int)uVar10)) {
                          uVar61 = uVar57;
                          uVar58 = (ulong)uVar10;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar43 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar43 < iVar65)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar43 * 4 +
                                       (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                              auVar218._4_4_ = uVar1;
                              auVar218._0_4_ = uVar1;
                              auVar218._8_4_ = uVar1;
                              auVar218._12_4_ = uVar1;
                              auVar218._16_4_ = uVar1;
                              auVar218._20_4_ = uVar1;
                              auVar218._24_4_ = uVar1;
                              auVar218._28_4_ = uVar1;
                              auVar230 = vfmadd231ps_fma(auVar458._0_32_,auVar218,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + (uVar61 & 0xffffffff) * 4
                                                          ));
                              auVar458 = ZEXT1664(auVar230);
                            }
                            uVar61 = uVar61 + 8;
                            iVar41 = iVar41 + iVar54;
                            uVar58 = uVar58 - 1;
                          } while (uVar58 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 8;
                      } while (uVar66 != uVar11);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 8) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar147 = auVar458._0_32_;
                auVar455 = auVar340._0_32_;
                auVar137 = auVar152._0_32_;
                auVar141 = auVar387._0_32_;
                auVar143 = auVar395._0_32_;
                fVar69 = auVar340._0_4_;
                fVar68 = auVar340._4_4_;
                fVar485 = auVar340._8_4_;
                fVar228 = auVar340._12_4_;
                fVar229 = auVar340._16_4_;
                fVar25 = auVar340._20_4_;
                fVar154 = auVar340._24_4_;
                fVar26 = auVar340._28_4_;
                auVar153._28_36_ = auVar458._28_36_;
                switch(uVar12) {
                case 1:
                  auVar147 = vmaxps_avx(auVar147,_DAT_005516a0);
                  break;
                case 2:
                  auVar455 = vmaxps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar147 = vminps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar151._4_4_ = uVar1;
                  auVar151._0_4_ = uVar1;
                  auVar151._8_4_ = uVar1;
                  auVar151._12_4_ = uVar1;
                  auVar151._16_4_ = uVar1;
                  auVar151._20_4_ = uVar1;
                  auVar151._24_4_ = uVar1;
                  auVar151._28_4_ = uVar1;
                  auVar230 = vfmadd213ps_fma(auVar151,auVar147,auVar455);
                  auVar147 = ZEXT1632(auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar225._4_4_ = uVar1;
                  auVar225._0_4_ = uVar1;
                  auVar225._8_4_ = uVar1;
                  auVar225._12_4_ = uVar1;
                  auVar225._16_4_ = uVar1;
                  auVar225._20_4_ = uVar1;
                  auVar225._24_4_ = uVar1;
                  auVar225._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar483._4_4_ = uVar1;
                  auVar483._0_4_ = uVar1;
                  auVar483._8_4_ = uVar1;
                  auVar483._12_4_ = uVar1;
                  auVar483._16_4_ = uVar1;
                  auVar483._20_4_ = uVar1;
                  auVar483._24_4_ = uVar1;
                  auVar483._28_4_ = uVar1;
                  auVar147 = vmaxps_avx(auVar147,auVar225);
                  auVar147 = vminps_avx(auVar483,auVar147);
                  break;
                case 4:
                  auVar148._0_8_ = auVar458._0_8_ ^ 0x8000000080000000;
                  auVar148._8_4_ = -auVar458._8_4_;
                  auVar148._12_4_ = -auVar458._12_4_;
                  auVar148._16_4_ = -auVar458._16_4_;
                  auVar148._20_4_ = -auVar458._20_4_;
                  auVar148._24_4_ = -auVar458._24_4_;
                  auVar148._28_4_ = auVar458._28_4_ ^ 0x80000000;
                  auVar108._8_4_ = 0x42b0c0a5;
                  auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar108._12_4_ = 0x42b0c0a5;
                  auVar108._16_4_ = 0x42b0c0a5;
                  auVar108._20_4_ = 0x42b0c0a5;
                  auVar108._24_4_ = 0x42b0c0a5;
                  auVar108._28_4_ = 0x42b0c0a5;
                  auVar147 = vminps_avx(auVar148,auVar108);
                  auVar141 = vmaxps_avx(auVar141,auVar147);
                  auVar230 = vfmadd213ps_fma(auVar143,auVar141,auVar339);
                  auVar143 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar143,1);
                  auVar147 = vandps_avx(auVar147,auVar455);
                  auVar147 = vsubps_avx(auVar143,auVar147);
                  auVar109._8_4_ = 0x3f318000;
                  auVar109._0_8_ = 0x3f3180003f318000;
                  auVar109._12_4_ = 0x3f318000;
                  auVar109._16_4_ = 0x3f318000;
                  auVar109._20_4_ = 0x3f318000;
                  auVar109._24_4_ = 0x3f318000;
                  auVar109._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar141,auVar147,auVar109);
                  auVar260._8_4_ = 0x395e8083;
                  auVar260._0_8_ = 0x395e8083395e8083;
                  auVar260._12_4_ = 0x395e8083;
                  auVar260._16_4_ = 0x395e8083;
                  auVar260._20_4_ = 0x395e8083;
                  auVar260._24_4_ = 0x395e8083;
                  auVar260._28_4_ = 0x395e8083;
                  auVar396 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar260);
                  auVar141 = ZEXT1632(auVar396);
                  auVar38._28_4_ = auVar143._28_4_;
                  auVar38._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar110._8_4_ = 0x3ab743ce;
                  auVar110._0_8_ = 0x3ab743ce3ab743ce;
                  auVar110._12_4_ = 0x3ab743ce;
                  auVar110._16_4_ = 0x3ab743ce;
                  auVar110._20_4_ = 0x3ab743ce;
                  auVar110._24_4_ = 0x3ab743ce;
                  auVar110._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar137,auVar141,auVar110);
                  auVar261._8_4_ = 0x3c088908;
                  auVar261._0_8_ = 0x3c0889083c088908;
                  auVar261._12_4_ = 0x3c088908;
                  auVar261._16_4_ = 0x3c088908;
                  auVar261._20_4_ = 0x3c088908;
                  auVar261._24_4_ = 0x3c088908;
                  auVar261._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar261);
                  auVar262._8_4_ = 0x3d2aa9c1;
                  auVar262._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar262._12_4_ = 0x3d2aa9c1;
                  auVar262._16_4_ = 0x3d2aa9c1;
                  auVar262._20_4_ = 0x3d2aa9c1;
                  auVar262._24_4_ = 0x3d2aa9c1;
                  auVar262._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar262);
                  auVar263._8_4_ = 0x3e2aaaaa;
                  auVar263._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar263._12_4_ = 0x3e2aaaaa;
                  auVar263._16_4_ = 0x3e2aaaaa;
                  auVar263._20_4_ = 0x3e2aaaaa;
                  auVar263._24_4_ = 0x3e2aaaaa;
                  auVar263._28_4_ = 0x3e2aaaaa;
                  auVar141 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar263);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar339);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar38,auVar141);
                  auVar117._0_4_ = (int)auVar147._0_4_;
                  auVar117._4_4_ = (int)auVar147._4_4_;
                  auVar117._8_4_ = (int)auVar147._8_4_;
                  auVar117._12_4_ = (int)auVar147._12_4_;
                  auVar149._16_4_ = (int)auVar147._16_4_;
                  auVar149._0_16_ = auVar117;
                  auVar149._20_4_ = (int)auVar147._20_4_;
                  auVar149._24_4_ = (int)auVar147._24_4_;
                  auVar149._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar117,0x17);
                  auVar230 = vpslld_avx(auVar149._16_16_,0x17);
                  auVar234._8_4_ = 0x3f800000;
                  auVar234._0_8_ = 0x3f8000003f800000;
                  auVar234._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar234);
                  auVar396 = vpaddd_avx(auVar396,auVar234);
                  auVar150._16_16_ = auVar230;
                  auVar150._0_16_ = auVar396;
                  auVar226._0_4_ = auVar349._0_4_ + fVar69;
                  auVar226._4_4_ = auVar349._4_4_ + fVar68;
                  auVar226._8_4_ = auVar349._8_4_ + fVar485;
                  auVar226._12_4_ = auVar349._12_4_ + fVar228;
                  auVar226._16_4_ = fVar229 + 0.0;
                  auVar226._20_4_ = fVar25 + 0.0;
                  auVar226._24_4_ = fVar154 + 0.0;
                  auVar226._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar150,auVar226,auVar455);
                  auVar147 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar147,auVar455);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar147,auVar147);
                  auVar147 = ZEXT1632(auVar230);
                  break;
                case 5:
                  auVar437._8_4_ = 0x42b0c0a5;
                  auVar437._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar437._12_4_ = 0x42b0c0a5;
                  auVar437._16_4_ = 0x42b0c0a5;
                  auVar437._20_4_ = 0x42b0c0a5;
                  auVar437._24_4_ = 0x42b0c0a5;
                  auVar437._28_4_ = 0x42b0c0a5;
                  auVar147 = vminps_avx(auVar437,auVar147);
                  auVar219 = vmaxps_avx(auVar141,auVar147);
                  auVar230 = vfmadd213ps_fma(auVar143,auVar219,auVar339);
                  auVar208 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar208,1);
                  auVar147 = vandps_avx(auVar147,auVar455);
                  auVar147 = vsubps_avx(auVar208,auVar147);
                  auVar345._8_4_ = 0x3f318000;
                  auVar345._0_8_ = 0x3f3180003f318000;
                  auVar345._12_4_ = 0x3f318000;
                  auVar345._16_4_ = 0x3f318000;
                  auVar345._20_4_ = 0x3f318000;
                  auVar345._24_4_ = 0x3f318000;
                  auVar345._28_4_ = 0x3f318000;
                  auVar230 = vfmsub231ps_fma(auVar219,auVar147,auVar345);
                  auVar100._8_4_ = 0xb95e8083;
                  auVar100._0_8_ = 0xb95e8083b95e8083;
                  auVar100._12_4_ = 0xb95e8083;
                  auVar100._16_4_ = 0xb95e8083;
                  auVar100._20_4_ = 0xb95e8083;
                  auVar100._24_4_ = 0xb95e8083;
                  auVar100._28_4_ = 0xb95e8083;
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar100);
                  auVar219 = ZEXT1632(auVar396);
                  auVar35._28_4_ = auVar208._28_4_;
                  auVar35._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar457._8_4_ = 0x3ab743ce;
                  auVar457._0_8_ = 0x3ab743ce3ab743ce;
                  auVar457._12_4_ = 0x3ab743ce;
                  auVar457._16_4_ = 0x3ab743ce;
                  auVar457._20_4_ = 0x3ab743ce;
                  auVar457._24_4_ = 0x3ab743ce;
                  auVar457._28_4_ = 0x3ab743ce;
                  auVar230 = vfmadd213ps_fma(auVar137,auVar219,auVar457);
                  auVar377._8_4_ = 0x3c088908;
                  auVar377._0_8_ = 0x3c0889083c088908;
                  auVar377._12_4_ = 0x3c088908;
                  auVar377._16_4_ = 0x3c088908;
                  auVar377._20_4_ = 0x3c088908;
                  auVar377._24_4_ = 0x3c088908;
                  auVar377._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar219,auVar377);
                  auVar324._8_4_ = 0x3d2aa9c1;
                  auVar324._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar324._12_4_ = 0x3d2aa9c1;
                  auVar324._16_4_ = 0x3d2aa9c1;
                  auVar324._20_4_ = 0x3d2aa9c1;
                  auVar324._24_4_ = 0x3d2aa9c1;
                  auVar324._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar219,auVar324);
                  auVar101._8_4_ = 0x3e2aaaaa;
                  auVar101._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar101._12_4_ = 0x3e2aaaaa;
                  auVar101._16_4_ = 0x3e2aaaaa;
                  auVar101._20_4_ = 0x3e2aaaaa;
                  auVar101._24_4_ = 0x3e2aaaaa;
                  auVar101._28_4_ = 0x3e2aaaaa;
                  auVar219 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar219,auVar101);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar219,auVar339);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar35,auVar219);
                  auVar220._0_4_ = auVar230._0_4_ + fVar69;
                  auVar220._4_4_ = auVar230._4_4_ + fVar68;
                  auVar220._8_4_ = auVar230._8_4_ + fVar485;
                  auVar220._12_4_ = auVar230._12_4_ + fVar228;
                  auVar220._16_4_ = fVar229 + 0.0;
                  auVar220._20_4_ = fVar25 + 0.0;
                  auVar220._24_4_ = fVar154 + 0.0;
                  auVar220._28_4_ = fVar26 + 0.0;
                  auVar233._0_4_ = (int)auVar147._0_4_;
                  auVar233._4_4_ = (int)auVar147._4_4_;
                  auVar233._8_4_ = (int)auVar147._8_4_;
                  auVar233._12_4_ = (int)auVar147._12_4_;
                  auVar256._16_4_ = (int)auVar147._16_4_;
                  auVar256._0_16_ = auVar233;
                  auVar256._20_4_ = (int)auVar147._20_4_;
                  auVar256._24_4_ = (int)auVar147._24_4_;
                  auVar256._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar233,0x17);
                  auVar230 = vpslld_avx(auVar256._16_16_,0x17);
                  auVar355._8_4_ = 0x3f800000;
                  auVar355._0_8_ = 0x3f8000003f800000;
                  auVar355._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar355,auVar230);
                  auVar396 = vpaddd_avx(auVar396,auVar355);
                  auVar481._16_16_ = auVar230;
                  auVar481._0_16_ = auVar396;
                  auVar349 = vfmadd213ps_fma(auVar481,auVar220,auVar455);
                  auVar102._8_4_ = 0x800000;
                  auVar102._0_8_ = 0x80000000800000;
                  auVar102._12_4_ = 0x800000;
                  auVar102._16_4_ = 0x800000;
                  auVar102._20_4_ = 0x800000;
                  auVar102._24_4_ = 0x800000;
                  auVar102._28_4_ = 0x800000;
                  auVar147 = vmaxps_avx(ZEXT1632(auVar349),auVar102);
                  auVar396 = vpsrld_avx(auVar147._0_16_,0x17);
                  auVar230 = vpsrld_avx(auVar147._16_16_,0x17);
                  auVar103._8_4_ = 0x807fffff;
                  auVar103._0_8_ = 0x807fffff807fffff;
                  auVar103._12_4_ = 0x807fffff;
                  auVar103._16_4_ = 0x807fffff;
                  auVar103._20_4_ = 0x807fffff;
                  auVar103._24_4_ = 0x807fffff;
                  auVar103._28_4_ = 0x807fffff;
                  auVar147 = vandps_avx(auVar147,auVar103);
                  auVar208 = vorps_avx(auVar147,auVar339);
                  auVar104._8_4_ = 0x3f3504f3;
                  auVar104._0_8_ = 0x3f3504f33f3504f3;
                  auVar104._12_4_ = 0x3f3504f3;
                  auVar104._16_4_ = 0x3f3504f3;
                  auVar104._20_4_ = 0x3f3504f3;
                  auVar104._24_4_ = 0x3f3504f3;
                  auVar104._28_4_ = 0x3f3504f3;
                  auVar219 = vcmpps_avx(auVar104,auVar208,2);
                  auVar147 = vandnps_avx(auVar219,auVar208);
                  auVar221._0_4_ = auVar147._0_4_ + auVar208._0_4_ + -1.0;
                  auVar221._4_4_ = auVar147._4_4_ + auVar208._4_4_ + -1.0;
                  auVar221._8_4_ = auVar147._8_4_ + auVar208._8_4_ + -1.0;
                  auVar221._12_4_ = auVar147._12_4_ + auVar208._12_4_ + -1.0;
                  auVar221._16_4_ = auVar147._16_4_ + auVar208._16_4_ + -1.0;
                  auVar221._20_4_ = auVar147._20_4_ + auVar208._20_4_ + -1.0;
                  auVar221._24_4_ = auVar147._24_4_ + auVar208._24_4_ + -1.0;
                  auVar221._28_4_ = auVar147._28_4_ + auVar208._28_4_ + -1.0;
                  auVar230 = vpsubd_avx(auVar230,auVar219._16_16_);
                  auVar423._8_4_ = 0xffffff81;
                  auVar423._0_8_ = 0xffffff81ffffff81;
                  auVar423._12_4_ = 0xffffff81;
                  auVar230 = vpaddd_avx(auVar230,auVar423);
                  auVar396 = vpsubd_avx(auVar396,auVar219._0_16_);
                  auVar396 = vpaddd_avx(auVar423,auVar396);
                  auVar257._16_16_ = auVar230;
                  auVar257._0_16_ = auVar396;
                  auVar36._4_4_ = auVar221._4_4_ * auVar221._4_4_;
                  auVar36._0_4_ = auVar221._0_4_ * auVar221._0_4_;
                  auVar36._8_4_ = auVar221._8_4_ * auVar221._8_4_;
                  auVar36._12_4_ = auVar221._12_4_ * auVar221._12_4_;
                  auVar36._16_4_ = auVar221._16_4_ * auVar221._16_4_;
                  auVar36._20_4_ = auVar221._20_4_ * auVar221._20_4_;
                  auVar36._24_4_ = auVar221._24_4_ * auVar221._24_4_;
                  auVar36._28_4_ = auVar219._28_4_;
                  auVar416._8_4_ = 0x3d9021bb;
                  auVar416._0_8_ = 0x3d9021bb3d9021bb;
                  auVar416._12_4_ = 0x3d9021bb;
                  auVar416._16_4_ = 0x3d9021bb;
                  auVar416._20_4_ = 0x3d9021bb;
                  auVar416._24_4_ = 0x3d9021bb;
                  auVar416._28_4_ = 0x3d9021bb;
                  auVar378._8_4_ = 0xbdebd1b8;
                  auVar378._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar378._12_4_ = 0xbdebd1b8;
                  auVar378._16_4_ = 0xbdebd1b8;
                  auVar378._20_4_ = 0xbdebd1b8;
                  auVar378._24_4_ = 0xbdebd1b8;
                  auVar378._28_4_ = 0xbdebd1b8;
                  auVar230 = vfmadd213ps_fma(auVar416,auVar221,auVar378);
                  auVar379._8_4_ = 0x3def251a;
                  auVar379._0_8_ = 0x3def251a3def251a;
                  auVar379._12_4_ = 0x3def251a;
                  auVar379._16_4_ = 0x3def251a;
                  auVar379._20_4_ = 0x3def251a;
                  auVar379._24_4_ = 0x3def251a;
                  auVar379._28_4_ = 0x3def251a;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar379);
                  auVar380._8_4_ = 0xbdfe5d4f;
                  auVar380._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar380._12_4_ = 0xbdfe5d4f;
                  auVar380._16_4_ = 0xbdfe5d4f;
                  auVar380._20_4_ = 0xbdfe5d4f;
                  auVar380._24_4_ = 0xbdfe5d4f;
                  auVar380._28_4_ = 0xbdfe5d4f;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar380);
                  auVar381._8_4_ = 0x3e11e9bf;
                  auVar381._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar381._12_4_ = 0x3e11e9bf;
                  auVar381._16_4_ = 0x3e11e9bf;
                  auVar381._20_4_ = 0x3e11e9bf;
                  auVar381._24_4_ = 0x3e11e9bf;
                  auVar381._28_4_ = 0x3e11e9bf;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar381);
                  auVar382._8_4_ = 0xbe2aae50;
                  auVar382._0_8_ = 0xbe2aae50be2aae50;
                  auVar382._12_4_ = 0xbe2aae50;
                  auVar382._16_4_ = 0xbe2aae50;
                  auVar382._20_4_ = 0xbe2aae50;
                  auVar382._24_4_ = 0xbe2aae50;
                  auVar382._28_4_ = 0xbe2aae50;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar382);
                  auVar383._8_4_ = 0x3e4cceac;
                  auVar383._0_8_ = 0x3e4cceac3e4cceac;
                  auVar383._12_4_ = 0x3e4cceac;
                  auVar383._16_4_ = 0x3e4cceac;
                  auVar383._20_4_ = 0x3e4cceac;
                  auVar383._24_4_ = 0x3e4cceac;
                  auVar383._28_4_ = 0x3e4cceac;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar383);
                  auVar384._8_4_ = 0xbe7ffffc;
                  auVar384._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar384._12_4_ = 0xbe7ffffc;
                  auVar384._16_4_ = 0xbe7ffffc;
                  auVar384._20_4_ = 0xbe7ffffc;
                  auVar384._24_4_ = 0xbe7ffffc;
                  auVar384._28_4_ = 0xbe7ffffc;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar384);
                  auVar385._8_4_ = 0x3eaaaaaa;
                  auVar385._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar385._12_4_ = 0x3eaaaaaa;
                  auVar385._16_4_ = 0x3eaaaaaa;
                  auVar385._20_4_ = 0x3eaaaaaa;
                  auVar385._24_4_ = 0x3eaaaaaa;
                  auVar385._28_4_ = 0x3eaaaaaa;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar221,auVar385);
                  auVar417._0_4_ = auVar221._0_4_ * auVar221._0_4_ * auVar221._0_4_ * auVar230._0_4_
                  ;
                  auVar417._4_4_ = auVar221._4_4_ * auVar221._4_4_ * auVar221._4_4_ * auVar230._4_4_
                  ;
                  auVar417._8_4_ = auVar221._8_4_ * auVar221._8_4_ * auVar221._8_4_ * auVar230._8_4_
                  ;
                  auVar417._12_4_ =
                       auVar221._12_4_ * auVar221._12_4_ * auVar221._12_4_ * auVar230._12_4_;
                  auVar417._16_4_ = auVar221._16_4_ * auVar221._16_4_ * auVar221._16_4_ * 0.0;
                  auVar417._20_4_ = auVar221._20_4_ * auVar221._20_4_ * auVar221._20_4_ * 0.0;
                  auVar417._24_4_ = auVar221._24_4_ * auVar221._24_4_ * auVar221._24_4_ * 0.0;
                  auVar417._28_4_ = 0;
                  auVar219 = vcvtdq2ps_avx(auVar257);
                  auVar438._8_4_ = 0xb95e8083;
                  auVar438._0_8_ = 0xb95e8083b95e8083;
                  auVar438._12_4_ = 0xb95e8083;
                  auVar438._16_4_ = 0xb95e8083;
                  auVar438._20_4_ = 0xb95e8083;
                  auVar438._24_4_ = 0xb95e8083;
                  auVar438._28_4_ = 0xb95e8083;
                  auVar230 = vfmadd231ps_fma(auVar417,auVar219,auVar438);
                  auVar230 = vfmsub231ps_fma(ZEXT1632(auVar230),auVar339,auVar36);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar349),ZEXT832(0) << 0x20,2);
                  auVar208 = vsubps_avx(ZEXT1632(auVar230),auVar221);
                  auVar230 = vfmsub231ps_fma(auVar208,auVar345,auVar219);
                  auVar386._8_4_ = 0xc0000000;
                  auVar386._0_8_ = 0xc0000000c0000000;
                  auVar386._12_4_ = 0xc0000000;
                  auVar386._16_4_ = 0xc0000000;
                  auVar386._20_4_ = 0xc0000000;
                  auVar386._24_4_ = 0xc0000000;
                  auVar386._28_4_ = 0xc0000000;
                  auVar222._0_4_ = auVar230._0_4_ * -2.0;
                  auVar222._4_4_ = auVar230._4_4_ * -2.0;
                  auVar222._8_4_ = auVar230._8_4_ * -2.0;
                  auVar222._12_4_ = auVar230._12_4_ * -2.0;
                  auVar222._16_4_ = 0x80000000;
                  auVar222._20_4_ = 0x80000000;
                  auVar222._24_4_ = 0x80000000;
                  auVar222._28_4_ = 0;
                  auVar258._8_4_ = 0x7fffffff;
                  auVar258._0_8_ = 0x7fffffff7fffffff;
                  auVar258._12_4_ = 0x7fffffff;
                  auVar258._16_4_ = 0x7fffffff;
                  auVar258._20_4_ = 0x7fffffff;
                  auVar258._24_4_ = 0x7fffffff;
                  auVar258._28_4_ = 0x7fffffff;
                  auVar147 = vblendvps_avx(auVar222,auVar258,auVar147);
                  auVar147 = vminps_avx(auVar437,auVar147);
                  auVar387 = ZEXT3264(auVar141);
                  auVar141 = vmaxps_avx(auVar141,auVar147);
                  auVar395 = ZEXT3264(auVar143);
                  auVar230 = vfmadd213ps_fma(auVar143,auVar141,auVar339);
                  auVar143 = vroundps_avx(ZEXT1632(auVar230),1);
                  auVar147 = vcmpps_avx(ZEXT1632(auVar230),auVar143,1);
                  auVar147 = vandps_avx(auVar147,auVar455);
                  auVar147 = vsubps_avx(auVar143,auVar147);
                  auVar230 = vfmsub231ps_fma(auVar141,auVar147,auVar345);
                  auVar396 = vfnmsub231ps_fma(ZEXT1632(auVar230),auVar147,auVar438);
                  auVar141 = ZEXT1632(auVar396);
                  auVar37._28_4_ = auVar143._28_4_;
                  auVar37._0_28_ =
                       ZEXT1628(CONCAT412(auVar396._12_4_ * auVar396._12_4_,
                                          CONCAT48(auVar396._8_4_ * auVar396._8_4_,
                                                   CONCAT44(auVar396._4_4_ * auVar396._4_4_,
                                                            auVar396._0_4_ * auVar396._0_4_))));
                  auVar152 = ZEXT3264(auVar137);
                  auVar230 = vfmadd213ps_fma(auVar137,auVar141,auVar457);
                  auVar482._8_4_ = 0x3c088908;
                  auVar482._0_8_ = 0x3c0889083c088908;
                  auVar482._12_4_ = 0x3c088908;
                  auVar482._16_4_ = 0x3c088908;
                  auVar482._20_4_ = 0x3c088908;
                  auVar482._24_4_ = 0x3c088908;
                  auVar482._28_4_ = 0x3c088908;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar482);
                  auVar105._8_4_ = 0x3d2aa9c1;
                  auVar105._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar105._12_4_ = 0x3d2aa9c1;
                  auVar105._16_4_ = 0x3d2aa9c1;
                  auVar105._20_4_ = 0x3d2aa9c1;
                  auVar105._24_4_ = 0x3d2aa9c1;
                  auVar105._28_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar105);
                  auVar106._8_4_ = 0x3e2aaaaa;
                  auVar106._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar106._12_4_ = 0x3e2aaaaa;
                  auVar106._16_4_ = 0x3e2aaaaa;
                  auVar106._20_4_ = 0x3e2aaaaa;
                  auVar106._24_4_ = 0x3e2aaaaa;
                  auVar106._28_4_ = 0x3e2aaaaa;
                  auVar141 = ZEXT1632(auVar396);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar106);
                  auVar230 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar141,auVar339);
                  auVar349 = vfmadd213ps_fma(ZEXT1632(auVar230),auVar37,auVar141);
                  auVar340 = ZEXT3264(auVar455);
                  auVar167._0_4_ = (int)auVar147._0_4_;
                  auVar167._4_4_ = (int)auVar147._4_4_;
                  auVar167._8_4_ = (int)auVar147._8_4_;
                  auVar167._12_4_ = (int)auVar147._12_4_;
                  auVar223._16_4_ = (int)auVar147._16_4_;
                  auVar223._0_16_ = auVar167;
                  auVar223._20_4_ = (int)auVar147._20_4_;
                  auVar223._24_4_ = (int)auVar147._24_4_;
                  auVar223._28_4_ = (int)auVar147._28_4_;
                  auVar396 = vpslld_avx(auVar167,0x17);
                  auVar230 = vpslld_avx(auVar223._16_16_,0x17);
                  auVar283._8_4_ = 0x3f800000;
                  auVar283._0_8_ = 0x3f8000003f800000;
                  auVar283._12_4_ = 0x3f800000;
                  auVar230 = vpaddd_avx(auVar230,auVar283);
                  auVar396 = vpaddd_avx(auVar396,auVar283);
                  auVar224._16_16_ = auVar230;
                  auVar224._0_16_ = auVar396;
                  auVar259._0_4_ = auVar349._0_4_ + fVar69;
                  auVar259._4_4_ = auVar349._4_4_ + fVar68;
                  auVar259._8_4_ = auVar349._8_4_ + fVar485;
                  auVar259._12_4_ = auVar349._12_4_ + fVar228;
                  auVar259._16_4_ = fVar229 + 0.0;
                  auVar259._20_4_ = fVar25 + 0.0;
                  auVar259._24_4_ = fVar154 + 0.0;
                  auVar259._28_4_ = fVar26 + 0.0;
                  auVar230 = vfmadd213ps_fma(auVar224,auVar259,auVar455);
                  auVar147 = vrcpps_avx(ZEXT1632(auVar230));
                  auVar230 = vfmsub213ps_fma(ZEXT1632(auVar230),auVar147,auVar455);
                  auVar230 = vfnmadd132ps_fma(ZEXT1632(auVar230),auVar147,auVar147);
                  auVar107._8_4_ = 0xbf800000;
                  auVar107._0_8_ = 0xbf800000bf800000;
                  auVar107._12_4_ = 0xbf800000;
                  auVar107._16_4_ = 0xbf800000;
                  auVar107._20_4_ = 0xbf800000;
                  auVar107._24_4_ = 0xbf800000;
                  auVar107._28_4_ = 0xbf800000;
                  auVar230 = vfnmadd213ps_fma(ZEXT1632(auVar230),auVar386,auVar107);
                  auVar194 = ZEXT1628(auVar230);
                  goto LAB_002bb37c;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar227._4_4_ = uVar1;
                  auVar227._0_4_ = uVar1;
                  auVar227._8_4_ = uVar1;
                  auVar227._12_4_ = uVar1;
                  auVar227._16_4_ = uVar1;
                  auVar227._20_4_ = uVar1;
                  auVar227._24_4_ = uVar1;
                  auVar227._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar264._4_4_ = uVar1;
                  auVar264._0_4_ = uVar1;
                  auVar264._8_4_ = uVar1;
                  auVar264._12_4_ = uVar1;
                  auVar264._16_4_ = uVar1;
                  auVar264._20_4_ = uVar1;
                  auVar264._24_4_ = uVar1;
                  auVar264._28_4_ = uVar1;
                  auVar230 = vfmadd231ps_fma(auVar264,auVar147,auVar227);
                  auVar147 = vmaxps_avx(ZEXT1632(auVar230),_DAT_005516a0);
                  auVar147 = vminps_avx(auVar147,auVar455);
                  auVar194 = auVar147._0_28_;
LAB_002bb37c:
                  auVar153._0_4_ = auVar194._0_4_ * auVar458._0_4_;
                  auVar153._4_4_ = auVar194._4_4_ * auVar458._4_4_;
                  auVar153._8_4_ = auVar194._8_4_ * auVar458._8_4_;
                  auVar153._12_4_ = auVar194._12_4_ * auVar458._12_4_;
                  auVar153._16_4_ = auVar194._16_4_ * auVar458._16_4_;
                  auVar153._20_4_ = auVar194._20_4_ * auVar458._20_4_;
                  auVar153._24_4_ = auVar194._24_4_ * auVar458._24_4_;
                  auVar147 = auVar153._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var56 = auVar147;
                ppp_Var56 = ppp_Var56 + 4;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar8 == 8) && (local_144 == 1)) && (local_40 = (long)local_c8.c, 0 < local_40)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      iVar65 = *(int *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_48 = CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize) * local_c8.cstep;
      local_50 = (Allocator *)local_c8.data;
      iVar46 = bottom_blob->w;
      iVar55 = bottom_blob->h;
      uVar13 = bottom_blob->c;
      local_1a0 = 0;
      do {
        if (0 < iVar7) {
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          local_178 = (_func_int ***)((long)&local_50->_vptr_Allocator + local_48 * local_1a0);
          pvVar67 = (this->weight_data_tm).data;
          iVar64 = 0;
          do {
            if (0 < iVar6) {
              iVar42 = bottom_blob->w;
              pvVar16 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pfVar21 = *(float **)(&this->field_0x118 + (long)p_Var48);
              uVar62 = 0;
              iVar41 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  fVar69 = 0.0;
                }
                else {
                  fVar69 = *(float *)(lVar60 + local_1a0 * 4);
                }
                if ((int)uVar13 < 1) {
                  auVar147 = SUB6432(ZEXT864(0),0);
                }
                else {
                  auVar340 = ZEXT864(0);
                  uVar59 = 0;
                  pvVar63 = (void *)(sVar17 * local_1a0 * sVar18 + (long)pvVar67);
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar43 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar64;
                        if ((((-1 < iVar43) && (iVar44 = iVar43 / iVar9, iVar43 % iVar9 == 0)) &&
                            (0 < (int)uVar10)) && (iVar44 < iVar55)) {
                          uVar61 = (ulong)uVar10;
                          uVar58 = uVar57;
                          iVar43 = iVar41;
                          do {
                            if (((-1 < iVar43) && (iVar45 = iVar43 / iVar47, iVar43 % iVar47 == 0))
                               && (iVar45 < iVar46)) {
                              auVar230 = vfmadd231ps_fma(auVar340._0_32_,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar16 +
                                                          (long)(iVar45 << 3) * 4 +
                                                          (long)iVar44 * (long)iVar42 * sVar19 +
                                                          sVar20 * sVar19 * uVar59),
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar63 + (uVar58 & 0xffffffff) * 4
                                                          ));
                              auVar340 = ZEXT1664(auVar230);
                            }
                            uVar58 = uVar58 + 8;
                            iVar43 = iVar43 + iVar54;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 8;
                      } while (uVar66 != uVar11);
                    }
                    auVar147 = auVar340._0_32_;
                    pvVar63 = (void *)((long)pvVar63 + (long)(int)(uVar10 * uVar11 * 8) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar118._0_4_ = auVar147._16_4_ + auVar147._0_4_;
                auVar118._4_4_ = auVar147._20_4_ + auVar147._4_4_;
                auVar118._8_4_ = auVar147._24_4_ + auVar147._8_4_;
                auVar118._12_4_ = auVar147._28_4_ + auVar147._12_4_;
                auVar230 = vshufpd_avx(auVar118,auVar118,1);
                auVar119._0_4_ = auVar230._0_4_ + auVar118._0_4_;
                auVar119._4_4_ = auVar230._4_4_ + auVar118._4_4_;
                auVar119._8_4_ = auVar230._8_4_ + auVar118._8_4_;
                auVar119._12_4_ = auVar230._12_4_ + auVar118._12_4_;
                auVar230 = vmovshdup_avx(auVar119);
                fVar69 = auVar230._0_4_ + fVar69 + auVar119._0_4_;
                auVar230 = ZEXT416((uint)fVar69);
                fVar68 = fVar69;
                if (iVar65 - 1U < 6) {
                  switch(iVar65) {
                  case 1:
                    auVar230 = vmaxss_avx(ZEXT416((uint)fVar69),ZEXT416(0));
                    fVar68 = auVar230._0_4_;
                    break;
                  case 2:
                    auVar77._0_12_ = ZEXT812(0);
                    auVar77._12_4_ = 0;
                    auVar230 = vcmpss_avx(auVar77,ZEXT416((uint)fVar69),1);
                    auVar169._8_4_ = 0x3f800000;
                    auVar169._0_8_ = 0x3f8000003f800000;
                    auVar169._12_4_ = 0x3f800000;
                    auVar230 = vblendvps_avx(ZEXT416((uint)*pfVar21),auVar169,auVar230);
                    fVar68 = auVar230._0_4_ * fVar69;
                    break;
                  case 3:
                    auVar230 = vmaxss_avx(auVar230,ZEXT416((uint)*pfVar21));
                    fVar68 = auVar230._0_4_;
                    if (pfVar21[1] < auVar230._0_4_) {
                      fVar68 = pfVar21[1];
                    }
                    break;
                  case 4:
                    auVar230 = vminss_avx(auVar230,ZEXT416(0x42b0c0a5));
                    auVar120._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
                    auVar120._8_4_ = auVar230._8_4_ ^ 0x80000000;
                    auVar120._12_4_ = auVar230._12_4_ ^ 0x80000000;
                    auVar230 = vcmpss_avx(auVar230,ZEXT416(0xc2b0c0a5),1);
                    auVar168._8_4_ = 0x42b0c0a5;
                    auVar168._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar168._12_4_ = 0x42b0c0a5;
                    auVar230 = vblendvps_avx(auVar120,auVar168,auVar230);
                    fVar69 = expf(auVar230._0_4_);
                    fVar68 = 1.0 / (fVar69 + 1.0);
                    break;
                  case 5:
                    fVar68 = expf(fVar69);
                    fVar68 = logf(fVar68 + 1.0);
                    fVar68 = tanhf(fVar68);
                    fVar68 = fVar68 * fVar69;
                    break;
                  case 6:
                    fVar485 = *pfVar21;
                    fVar228 = -pfVar21[1] / fVar485;
                    fVar68 = 0.0;
                    if ((fVar228 <= fVar69) && (fVar68 = fVar69, fVar69 <= fVar228 + 1.0 / fVar485))
                    {
                      auVar230 = vfmadd213ss_fma(ZEXT416((uint)fVar485),auVar230,
                                                 ZEXT416((uint)pfVar21[1]));
                      fVar68 = auVar230._0_4_ * fVar69;
                    }
                  }
                }
                *(float *)local_178 = fVar68;
                local_178 = (_func_int ***)((long)local_178 + 4);
                uVar62 = uVar62 + 1;
                iVar41 = iVar41 + 1;
              } while (uVar62 != iVar6);
            }
            iVar64 = iVar64 + 1;
          } while (iVar64 != iVar7);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_40);
    }
    iVar7 = local_c8.h;
    iVar6 = local_c8.w;
    if (((iVar8 == 4) && (local_144 == 4)) && (0 < (long)local_c8.c)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_1a0 = 0;
      auVar387 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar337._8_4_ = 0x3f000000;
      auVar337._0_8_ = 0x3f0000003f000000;
      auVar337._12_4_ = 0x3f000000;
      auVar340 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar454._8_4_ = 0x3ab743ce;
      auVar454._0_8_ = 0x3ab743ce3ab743ce;
      auVar454._12_4_ = 0x3ab743ce;
      auVar235._8_4_ = 0x3c088908;
      auVar235._0_8_ = 0x3c0889083c088908;
      auVar235._12_4_ = 0x3c088908;
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_1a0 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar121 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar121 = *(undefined1 (*) [16])(lVar60 + local_1a0 * 0x10);
                }
                auVar395 = ZEXT1664(auVar121);
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar66 = 0;
                      uVar57 = 0;
                      do {
                        iVar41 = (((int)uVar57 - uVar11) + 1) * iVar53 + iVar55;
                        if (((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                           ((0 < (int)uVar10 && (iVar42 < iVar46)))) {
                          lVar51 = (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar61 = uVar66;
                          uVar58 = (ulong)uVar10;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar42 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar42 < iVar65)) {
                              lVar49 = (long)(iVar42 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51);
                              auVar170._4_4_ = uVar1;
                              auVar170._0_4_ = uVar1;
                              auVar170._8_4_ = uVar1;
                              auVar170._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 4);
                              auVar284._4_4_ = uVar1;
                              auVar284._0_4_ = uVar1;
                              auVar284._8_4_ = uVar1;
                              auVar284._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 8);
                              auVar356._4_4_ = uVar1;
                              auVar356._0_4_ = uVar1;
                              auVar356._8_4_ = uVar1;
                              auVar356._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar49 * 4 + lVar51 + 0xc);
                              auVar390._4_4_ = uVar1;
                              auVar390._0_4_ = uVar1;
                              auVar390._8_4_ = uVar1;
                              auVar390._12_4_ = uVar1;
                              uVar50 = uVar61 & 0xffffffff;
                              auVar230 = vfmadd231ps_fma(auVar395._0_16_,auVar170,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar284,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x10));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar356,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x20));
                              auVar230 = vfmadd231ps_fma(auVar230,auVar390,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar50 * 4 + 0x30));
                              auVar395 = ZEXT1664(auVar230);
                            }
                            uVar61 = uVar61 + 0x10;
                            iVar41 = iVar41 + iVar54;
                            uVar58 = uVar58 - 1;
                          } while (uVar58 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar66 = uVar66 + (ulong)uVar10 * 0x10;
                      } while (uVar57 != uVar11);
                    }
                    auVar121 = auVar395._0_16_;
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 0x10) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar396 = auVar387._0_16_;
                auVar230 = auVar340._0_16_;
                fVar69 = auVar340._0_4_;
                fVar68 = auVar340._4_4_;
                fVar485 = auVar340._8_4_;
                fVar228 = auVar340._12_4_;
                fVar154 = auVar121._4_4_;
                fVar229 = auVar121._8_4_;
                fVar25 = auVar121._12_4_;
                switch(uVar12) {
                case 1:
                  auVar121 = vmaxps_avx(auVar396,auVar121);
                  break;
                case 2:
                  auVar230 = vmaxps_avx(auVar396,auVar121);
                  auVar396 = vminps_avx(auVar396,auVar121);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar124._4_4_ = uVar1;
                  auVar124._0_4_ = uVar1;
                  auVar124._8_4_ = uVar1;
                  auVar124._12_4_ = uVar1;
                  auVar121 = vfmadd213ps_fma(auVar124,auVar396,auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar361._4_4_ = uVar1;
                  auVar361._0_4_ = uVar1;
                  auVar361._8_4_ = uVar1;
                  auVar361._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar468._4_4_ = uVar1;
                  auVar468._0_4_ = uVar1;
                  auVar468._8_4_ = uVar1;
                  auVar468._12_4_ = uVar1;
                  auVar230 = vmaxps_avx(auVar361,auVar121);
                  auVar121 = vminps_avx(auVar468,auVar230);
                  break;
                case 4:
                  auVar122._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
                  auVar122._8_4_ = -fVar229;
                  auVar122._12_4_ = -fVar25;
                  auVar176._8_4_ = 0x42b0c0a5;
                  auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar176._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar122,auVar176);
                  auVar177._8_4_ = 0xc2b0c0a5;
                  auVar177._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar177._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar177);
                  auVar362._8_4_ = 0x3fb8aa3b;
                  auVar362._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar362._12_4_ = 0x3fb8aa3b;
                  auVar396 = vfmadd213ps_fma(auVar362,auVar127,auVar337);
                  auVar469._0_4_ = (int)auVar396._0_4_;
                  auVar469._4_4_ = (int)auVar396._4_4_;
                  auVar469._8_4_ = (int)auVar396._8_4_;
                  auVar469._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar469);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar80._8_4_ = 0x3f318000;
                  auVar80._0_8_ = 0x3f3180003f318000;
                  auVar80._12_4_ = 0x3f318000;
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar80);
                  auVar178._8_4_ = 0x395e8083;
                  auVar178._0_8_ = 0x395e8083395e8083;
                  auVar178._12_4_ = 0x395e8083;
                  auVar127 = vfmsub231ps_fma(auVar349,auVar396,auVar178);
                  auVar470._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar470._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar470._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar470._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar402._8_4_ = 0x39506967;
                  auVar402._0_8_ = 0x3950696739506967;
                  auVar402._12_4_ = 0x39506967;
                  auVar179._8_4_ = 0x3ab743ce;
                  auVar179._0_8_ = 0x3ab743ce3ab743ce;
                  auVar179._12_4_ = 0x3ab743ce;
                  auVar349 = vfmadd213ps_fma(auVar402,auVar127,auVar179);
                  auVar180._8_4_ = 0x3c088908;
                  auVar180._0_8_ = 0x3c0889083c088908;
                  auVar180._12_4_ = 0x3c088908;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar180);
                  auVar81._8_4_ = 0x3d2aa9c1;
                  auVar81._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar81._12_4_ = 0x3d2aa9c1;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar81);
                  auVar82._8_4_ = 0x3e2aaaaa;
                  auVar82._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar82._12_4_ = 0x3e2aaaaa;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar82);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar337);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar470,auVar127);
                  auVar403._0_4_ = auVar349._0_4_ + fVar69;
                  auVar403._4_4_ = auVar349._4_4_ + fVar68;
                  auVar403._8_4_ = auVar349._8_4_ + fVar485;
                  auVar403._12_4_ = auVar349._12_4_ + fVar228;
                  auVar123._0_4_ = (int)auVar396._0_4_;
                  auVar123._4_4_ = (int)auVar396._4_4_;
                  auVar123._8_4_ = (int)auVar396._8_4_;
                  auVar123._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar123,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar349 = vfmadd213ps_fma(auVar396,auVar403,auVar230);
                  auVar387 = ZEXT464(0) << 0x20;
                  auVar396 = vrcpps_avx(auVar349);
                  auVar230 = vfmsub213ps_fma(auVar349,auVar396,auVar230);
                  auVar121 = vfnmadd132ps_fma(auVar230,auVar396,auVar396);
                  break;
                case 5:
                  auVar424._8_4_ = 0x42b0c0a5;
                  auVar424._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar424._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar424,auVar121);
                  auVar442._8_4_ = 0xc2b0c0a5;
                  auVar442._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar442._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar442);
                  auVar448._8_4_ = 0x3fb8aa3b;
                  auVar448._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar448._12_4_ = 0x3fb8aa3b;
                  auVar396 = vfmadd213ps_fma(auVar448,auVar127,auVar337);
                  auVar466._0_4_ = (int)auVar396._0_4_;
                  auVar466._4_4_ = (int)auVar396._4_4_;
                  auVar466._8_4_ = (int)auVar396._8_4_;
                  auVar466._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar466);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar425._8_4_ = 0x3f318000;
                  auVar425._0_8_ = 0x3f3180003f318000;
                  auVar425._12_4_ = 0x3f318000;
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar425);
                  auVar443._8_4_ = 0xb95e8083;
                  auVar443._0_8_ = 0xb95e8083b95e8083;
                  auVar443._12_4_ = 0xb95e8083;
                  auVar127 = vfnmsub231ps_fma(auVar349,auVar396,auVar443);
                  auVar467._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar467._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar467._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar467._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar343._8_4_ = 0x39506967;
                  auVar343._0_8_ = 0x3950696739506967;
                  auVar343._12_4_ = 0x39506967;
                  auVar349 = vfmadd213ps_fma(auVar343,auVar127,auVar454);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar235);
                  auVar326._8_4_ = 0x3d2aa9c1;
                  auVar326._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar326._12_4_ = 0x3d2aa9c1;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar326);
                  auVar285._8_4_ = 0x3e2aaaaa;
                  auVar285._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar285._12_4_ = 0x3e2aaaaa;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar285);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar337);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar467,auVar127);
                  auVar171._0_4_ = auVar349._0_4_ + fVar69;
                  auVar171._4_4_ = auVar349._4_4_ + fVar68;
                  auVar171._8_4_ = auVar349._8_4_ + fVar485;
                  auVar171._12_4_ = auVar349._12_4_ + fVar228;
                  auVar357._0_4_ = (int)auVar396._0_4_;
                  auVar357._4_4_ = (int)auVar396._4_4_;
                  auVar357._8_4_ = (int)auVar396._8_4_;
                  auVar357._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar357,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar70 = vfmadd213ps_fma(auVar396,auVar171,auVar230);
                  auVar172._8_4_ = 0x800000;
                  auVar172._0_8_ = 0x80000000800000;
                  auVar172._12_4_ = 0x800000;
                  auVar396 = vmaxps_avx(auVar70,auVar172);
                  auVar349 = vpsrld_avx(auVar396,0x17);
                  auVar286._8_4_ = 0xffffff82;
                  auVar286._0_8_ = 0xffffff82ffffff82;
                  auVar286._12_4_ = 0xffffff82;
                  auVar349 = vpaddd_avx(auVar349,auVar286);
                  auVar287._8_4_ = 0x807fffff;
                  auVar287._0_8_ = 0x807fffff807fffff;
                  auVar287._12_4_ = 0x807fffff;
                  auVar396 = vandps_avx(auVar396,auVar287);
                  auVar418 = vorps_avx(auVar396,auVar337);
                  auVar127 = vcvtdq2ps_avx(auVar349);
                  auVar288._8_4_ = 0x3f3504f3;
                  auVar288._0_8_ = 0x3f3504f33f3504f3;
                  auVar288._12_4_ = 0x3f3504f3;
                  auVar349 = vcmpps_avx(auVar418,auVar288,1);
                  auVar396 = vandps_avx(auVar349,auVar418);
                  auVar173._0_4_ = auVar396._0_4_ + auVar418._0_4_ + -1.0;
                  auVar173._4_4_ = auVar396._4_4_ + auVar418._4_4_ + -1.0;
                  auVar173._8_4_ = auVar396._8_4_ + auVar418._8_4_ + -1.0;
                  auVar173._12_4_ = auVar396._12_4_ + auVar418._12_4_ + -1.0;
                  auVar396 = vandps_avx(auVar349,auVar230);
                  auVar349 = vsubps_avx(auVar127,auVar396);
                  auVar391._0_4_ = auVar173._0_4_ * auVar173._0_4_;
                  auVar391._4_4_ = auVar173._4_4_ * auVar173._4_4_;
                  auVar391._8_4_ = auVar173._8_4_ * auVar173._8_4_;
                  auVar391._12_4_ = auVar173._12_4_ * auVar173._12_4_;
                  auVar401._8_4_ = 0x3d9021bb;
                  auVar401._0_8_ = 0x3d9021bb3d9021bb;
                  auVar401._12_4_ = 0x3d9021bb;
                  auVar289._8_4_ = 0xbdebd1b8;
                  auVar289._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar289._12_4_ = 0xbdebd1b8;
                  auVar396 = vfmadd213ps_fma(auVar401,auVar173,auVar289);
                  auVar290._8_4_ = 0x3def251a;
                  auVar290._0_8_ = 0x3def251a3def251a;
                  auVar290._12_4_ = 0x3def251a;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar290);
                  auVar291._8_4_ = 0xbdfe5d4f;
                  auVar291._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar291._12_4_ = 0xbdfe5d4f;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar291);
                  auVar292._8_4_ = 0x3e11e9bf;
                  auVar292._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar292._12_4_ = 0x3e11e9bf;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar292);
                  auVar293._8_4_ = 0xbe2aae50;
                  auVar293._0_8_ = 0xbe2aae50be2aae50;
                  auVar293._12_4_ = 0xbe2aae50;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar293);
                  auVar294._8_4_ = 0x3e4cceac;
                  auVar294._0_8_ = 0x3e4cceac3e4cceac;
                  auVar294._12_4_ = 0x3e4cceac;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar294);
                  auVar295._8_4_ = 0xbe7ffffc;
                  auVar295._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar295._12_4_ = 0xbe7ffffc;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar295);
                  auVar296._8_4_ = 0x3eaaaaaa;
                  auVar296._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar296._12_4_ = 0x3eaaaaaa;
                  auVar396 = vfmadd213ps_fma(auVar396,auVar173,auVar296);
                  auVar297._0_4_ = auVar396._0_4_ * auVar391._0_4_ * auVar173._0_4_;
                  auVar297._4_4_ = auVar396._4_4_ * auVar391._4_4_ * auVar173._4_4_;
                  auVar297._8_4_ = auVar396._8_4_ * auVar391._8_4_ * auVar173._8_4_;
                  auVar297._12_4_ = auVar396._12_4_ * auVar391._12_4_ * auVar173._12_4_;
                  auVar387 = ZEXT864(0) << 0x20;
                  auVar396 = vfmadd231ps_fma(auVar297,auVar349,auVar443);
                  auVar127 = vfmsub231ps_fma(auVar396,auVar337,auVar391);
                  auVar396 = vcmpps_avx(auVar70,ZEXT816(0) << 0x20,2);
                  auVar127 = vsubps_avx(auVar127,auVar173);
                  auVar349 = vfnmadd231ps_fma(auVar127,auVar425,auVar349);
                  auVar174._0_4_ = auVar349._0_4_ + auVar349._0_4_;
                  auVar174._4_4_ = auVar349._4_4_ + auVar349._4_4_;
                  auVar174._8_4_ = auVar349._8_4_ + auVar349._8_4_;
                  auVar174._12_4_ = auVar349._12_4_ + auVar349._12_4_;
                  auVar298._8_4_ = 0x7fffffff;
                  auVar298._0_8_ = 0x7fffffff7fffffff;
                  auVar298._12_4_ = 0x7fffffff;
                  auVar396 = vblendvps_avx(auVar174,auVar298,auVar396);
                  auVar299._8_4_ = 0x42b0c0a5;
                  auVar299._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar299._12_4_ = 0x42b0c0a5;
                  auVar396 = vminps_avx(auVar396,auVar299);
                  auVar300._8_4_ = 0xc2b0c0a5;
                  auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar300._12_4_ = 0xc2b0c0a5;
                  auVar127 = vmaxps_avx(auVar396,auVar300);
                  auVar396 = vfmadd213ps_fma(auVar448,auVar127,auVar337);
                  auVar358._0_4_ = (int)auVar396._0_4_;
                  auVar358._4_4_ = (int)auVar396._4_4_;
                  auVar358._8_4_ = (int)auVar396._8_4_;
                  auVar358._12_4_ = (int)auVar396._12_4_;
                  auVar349 = vcvtdq2ps_avx(auVar358);
                  auVar396 = vcmpps_avx(auVar396,auVar349,1);
                  auVar396 = vandps_avx(auVar396,auVar230);
                  auVar396 = vsubps_avx(auVar349,auVar396);
                  auVar349 = vfmsub231ps_fma(auVar127,auVar396,auVar425);
                  auVar127 = vfnmsub231ps_fma(auVar349,auVar396,auVar443);
                  auVar359._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                  auVar359._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                  auVar359._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                  auVar359._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                  auVar349 = vfmadd213ps_fma(auVar343,auVar127,auVar454);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar235);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar326);
                  auVar340 = ZEXT1664(auVar230);
                  auVar78._8_4_ = 0x3e2aaaaa;
                  auVar78._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar78._12_4_ = 0x3e2aaaaa;
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar78);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar127,auVar337);
                  auVar349 = vfmadd213ps_fma(auVar349,auVar359,auVar127);
                  auVar175._0_4_ = auVar349._0_4_ + fVar69;
                  auVar175._4_4_ = auVar349._4_4_ + fVar68;
                  auVar175._8_4_ = auVar349._8_4_ + fVar485;
                  auVar175._12_4_ = auVar349._12_4_ + fVar228;
                  auVar301._0_4_ = (int)auVar396._0_4_;
                  auVar301._4_4_ = (int)auVar396._4_4_;
                  auVar301._8_4_ = (int)auVar396._8_4_;
                  auVar301._12_4_ = (int)auVar396._12_4_;
                  auVar396 = vpslld_avx(auVar301,0x17);
                  auVar396 = vpaddd_avx(auVar396,auVar230);
                  auVar396 = vfmadd213ps_fma(auVar396,auVar175,auVar230);
                  auVar230 = vrcpps_avx(auVar396);
                  auVar360._0_4_ = auVar230._0_4_ + auVar230._0_4_;
                  auVar360._4_4_ = auVar230._4_4_ + auVar230._4_4_;
                  auVar360._8_4_ = auVar230._8_4_ + auVar230._8_4_;
                  auVar360._12_4_ = auVar230._12_4_ + auVar230._12_4_;
                  auVar79._8_4_ = 0x40000000;
                  auVar79._0_8_ = 0x4000000040000000;
                  auVar79._12_4_ = 0x40000000;
                  auVar396 = vfmsub213ps_fma(auVar396,auVar360,auVar79);
                  auVar230 = vfnmadd213ps_fma(auVar396,auVar230,auVar360);
                  auVar121 = vfmsub231ps_fma(auVar121,auVar121,auVar230);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar181._4_4_ = uVar1;
                  auVar181._0_4_ = uVar1;
                  auVar181._8_4_ = uVar1;
                  auVar181._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar302._4_4_ = uVar1;
                  auVar302._0_4_ = uVar1;
                  auVar302._8_4_ = uVar1;
                  auVar302._12_4_ = uVar1;
                  auVar349 = vfmadd231ps_fma(auVar302,auVar121,auVar181);
                  auVar396 = vmaxps_avx(auVar396,auVar349);
                  auVar230 = vminps_avx(auVar396,auVar230);
                  auVar121._0_4_ = auVar230._0_4_ * auVar121._0_4_;
                  auVar121._4_4_ = auVar230._4_4_ * fVar154;
                  auVar121._8_4_ = auVar230._8_4_ * fVar229;
                  auVar121._12_4_ = auVar230._12_4_ * fVar25;
                }
                *(undefined1 (*) [16])ppp_Var56 = auVar121;
                ppp_Var56 = ppp_Var56 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar8 == 1) && (local_144 == 4)) && (0 < (long)local_c8.c)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_1a0 = 0;
      auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar458 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar153 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar387 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar338._8_4_ = 0x3f800000;
      auVar338._0_8_ = 0x3f8000003f800000;
      auVar338._12_4_ = 0x3f800000;
      auVar395 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
      auVar452 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      auVar340 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar459 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      do {
        if (0 < local_c8.h) {
          iVar65 = bottom_blob->w;
          iVar46 = bottom_blob->h;
          ppp_Var56 = (_func_int ***)
                      ((long)(_func_int ***)local_c8.data +
                      local_c8.cstep * local_1a0 *
                      CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar13 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_c8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  auVar471 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar471 = *(undefined1 (*) [16])(lVar60 + local_1a0 * 0x10);
                }
                auVar484 = ZEXT1664(auVar471);
                if (0 < (int)uVar13) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar41 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar55;
                        if (((-1 < iVar41) && (iVar42 = iVar41 / iVar9, iVar41 % iVar9 == 0)) &&
                           ((iVar42 < iVar46 && (0 < (int)uVar10)))) {
                          uVar61 = uVar57;
                          uVar58 = (ulong)uVar10;
                          iVar41 = iVar64;
                          do {
                            if (((-1 < iVar41) && (iVar43 = iVar41 / iVar47, iVar41 % iVar47 == 0))
                               && (iVar43 < iVar65)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar43 * 4 +
                                       (long)iVar42 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                              auVar125._4_4_ = uVar1;
                              auVar125._0_4_ = uVar1;
                              auVar125._8_4_ = uVar1;
                              auVar125._12_4_ = uVar1;
                              auVar230 = vfmadd231ps_fma(auVar484._0_16_,auVar125,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + (uVar61 & 0xffffffff) * 4
                                                          ));
                              auVar484 = ZEXT1664(auVar230);
                            }
                            uVar61 = uVar61 + 4;
                            iVar41 = iVar41 + iVar54;
                            uVar58 = uVar58 - 1;
                          } while (uVar58 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 4;
                      } while (uVar66 != uVar11);
                    }
                    auVar471 = auVar484._0_16_;
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar10 * uVar11 * 4) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar127 = auVar152._0_16_;
                auVar396 = auVar387._0_16_;
                auVar349 = auVar395._0_16_;
                auVar230 = auVar340._0_16_;
                auVar71 = auVar459._0_16_;
                auVar111 = auVar452._0_16_;
                auVar70 = auVar153._0_16_;
                auVar418 = auVar458._0_16_;
                fVar69 = auVar471._4_4_;
                fVar68 = auVar471._8_4_;
                fVar485 = auVar471._12_4_;
                switch(uVar12) {
                case 1:
                  auVar471 = vmaxps_avx(auVar471,auVar127);
                  break;
                case 2:
                  auVar230 = vmaxps_avx(auVar471,auVar127);
                  auVar396 = vminps_avx(auVar471,auVar127);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar474._4_4_ = uVar1;
                  auVar474._0_4_ = uVar1;
                  auVar474._8_4_ = uVar1;
                  auVar474._12_4_ = uVar1;
                  auVar471 = vfmadd213ps_fma(auVar474,auVar396,auVar230);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar129._4_4_ = uVar1;
                  auVar129._0_4_ = uVar1;
                  auVar129._8_4_ = uVar1;
                  auVar129._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar364._4_4_ = uVar1;
                  auVar364._0_4_ = uVar1;
                  auVar364._8_4_ = uVar1;
                  auVar364._12_4_ = uVar1;
                  auVar230 = vmaxps_avx(auVar471,auVar129);
                  auVar471 = vminps_avx(auVar364,auVar230);
                  break;
                case 4:
                  auVar130._0_8_ = auVar471._0_8_ ^ 0x8000000080000000;
                  auVar130._8_4_ = -fVar68;
                  auVar130._12_4_ = -fVar485;
                  auVar86._8_4_ = 0x42b0c0a5;
                  auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar86._12_4_ = 0x42b0c0a5;
                  auVar127 = vminps_avx(auVar130,auVar86);
                  auVar363 = vmaxps_avx(auVar418,auVar127);
                  auVar127 = vfmadd213ps_fma(auVar70,auVar363,auVar396);
                  auVar472._0_4_ = (int)auVar127._0_4_;
                  auVar472._4_4_ = (int)auVar127._4_4_;
                  auVar472._8_4_ = (int)auVar127._8_4_;
                  auVar472._12_4_ = (int)auVar127._12_4_;
                  auVar418 = vcvtdq2ps_avx(auVar472);
                  auVar127 = vcmpps_avx(auVar127,auVar418,1);
                  auVar127 = vandps_avx(auVar127,auVar338);
                  auVar127 = vsubps_avx(auVar418,auVar127);
                  auVar349 = vfmsub231ps_fma(auVar363,auVar127,auVar349);
                  auVar187._8_4_ = 0x395e8083;
                  auVar187._0_8_ = 0x395e8083395e8083;
                  auVar187._12_4_ = 0x395e8083;
                  auVar349 = vfmsub231ps_fma(auVar349,auVar127,auVar187);
                  auVar473._0_4_ = auVar349._0_4_ * auVar349._0_4_;
                  auVar473._4_4_ = auVar349._4_4_ * auVar349._4_4_;
                  auVar473._8_4_ = auVar349._8_4_ * auVar349._8_4_;
                  auVar473._12_4_ = auVar349._12_4_ * auVar349._12_4_;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar111);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar71);
                  auVar188._8_4_ = 0x3d2aa9c1;
                  auVar188._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar188._12_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar188);
                  auVar87._8_4_ = 0x3e2aaaaa;
                  auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar87._12_4_ = 0x3e2aaaaa;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar87);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar396);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar473,auVar349);
                  auVar131._0_4_ = auVar230._0_4_ + 1.0;
                  auVar131._4_4_ = auVar230._4_4_ + 1.0;
                  auVar131._8_4_ = auVar230._8_4_ + 1.0;
                  auVar131._12_4_ = auVar230._12_4_ + 1.0;
                  auVar365._0_4_ = (int)auVar127._0_4_;
                  auVar365._4_4_ = (int)auVar127._4_4_;
                  auVar365._8_4_ = (int)auVar127._8_4_;
                  auVar365._12_4_ = (int)auVar127._12_4_;
                  auVar230 = vpslld_avx(auVar365,0x17);
                  auVar230 = vpaddd_avx(auVar230,auVar338);
                  auVar396 = vfmadd213ps_fma(auVar230,auVar131,auVar338);
                  auVar230 = vrcpps_avx(auVar396);
                  auVar396 = vfmsub213ps_fma(auVar396,auVar230,auVar338);
                  auVar471 = vfnmadd132ps_fma(auVar396,auVar230,auVar230);
                  break;
                case 5:
                  auVar303._8_4_ = 0x42b0c0a5;
                  auVar303._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar303._12_4_ = 0x42b0c0a5;
                  auVar127 = vminps_avx(auVar471,auVar303);
                  auVar346 = vmaxps_avx(auVar418,auVar127);
                  auVar127 = vfmadd213ps_fma(auVar70,auVar346,auVar396);
                  auVar404._0_4_ = (int)auVar127._0_4_;
                  auVar404._4_4_ = (int)auVar127._4_4_;
                  auVar404._8_4_ = (int)auVar127._8_4_;
                  auVar404._12_4_ = (int)auVar127._12_4_;
                  auVar363 = vcvtdq2ps_avx(auVar404);
                  auVar127 = vcmpps_avx(auVar127,auVar363,1);
                  auVar127 = vandps_avx(auVar127,auVar338);
                  auVar127 = vsubps_avx(auVar363,auVar127);
                  auVar363 = vfmsub231ps_fma(auVar346,auVar127,auVar349);
                  auVar83._8_4_ = 0xb95e8083;
                  auVar83._0_8_ = 0xb95e8083b95e8083;
                  auVar83._12_4_ = 0xb95e8083;
                  auVar346 = vfnmsub231ps_fma(auVar363,auVar127,auVar83);
                  auVar405._0_4_ = auVar346._0_4_ * auVar346._0_4_;
                  auVar405._4_4_ = auVar346._4_4_ * auVar346._4_4_;
                  auVar405._8_4_ = auVar346._8_4_ * auVar346._8_4_;
                  auVar405._12_4_ = auVar346._12_4_ * auVar346._12_4_;
                  auVar363 = vfmadd213ps_fma(auVar230,auVar346,auVar111);
                  auVar363 = vfmadd213ps_fma(auVar363,auVar346,auVar71);
                  auVar327._8_4_ = 0x3d2aa9c1;
                  auVar327._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar327._12_4_ = 0x3d2aa9c1;
                  auVar363 = vfmadd213ps_fma(auVar363,auVar346,auVar327);
                  auVar328._8_4_ = 0x3e2aaaaa;
                  auVar328._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar328._12_4_ = 0x3e2aaaaa;
                  auVar363 = vfmadd213ps_fma(auVar363,auVar346,auVar328);
                  auVar363 = vfmadd213ps_fma(auVar363,auVar346,auVar396);
                  auVar363 = vfmadd213ps_fma(auVar363,auVar405,auVar346);
                  auVar182._0_4_ = auVar363._0_4_ + 1.0;
                  auVar182._4_4_ = auVar363._4_4_ + 1.0;
                  auVar182._8_4_ = auVar363._8_4_ + 1.0;
                  auVar182._12_4_ = auVar363._12_4_ + 1.0;
                  auVar126._0_4_ = (int)auVar127._0_4_;
                  auVar126._4_4_ = (int)auVar127._4_4_;
                  auVar126._8_4_ = (int)auVar127._8_4_;
                  auVar126._12_4_ = (int)auVar127._12_4_;
                  auVar127 = vpslld_avx(auVar126,0x17);
                  auVar127 = vpaddd_avx(auVar127,auVar338);
                  auVar72 = vfmadd213ps_fma(auVar127,auVar182,auVar338);
                  auVar183._8_4_ = 0x800000;
                  auVar183._0_8_ = 0x80000000800000;
                  auVar183._12_4_ = 0x800000;
                  auVar127 = vmaxps_avx(auVar72,auVar183);
                  auVar363 = vpsrld_avx(auVar127,0x17);
                  auVar329._8_4_ = 0xffffff82;
                  auVar329._0_8_ = 0xffffff82ffffff82;
                  auVar329._12_4_ = 0xffffff82;
                  auVar363 = vpaddd_avx(auVar363,auVar329);
                  auVar330._8_4_ = 0x807fffff;
                  auVar330._0_8_ = 0x807fffff807fffff;
                  auVar330._12_4_ = 0x807fffff;
                  auVar127 = vandps_avx(auVar127,auVar330);
                  auVar419 = vorps_avx(auVar127,auVar396);
                  auVar346 = vcvtdq2ps_avx(auVar363);
                  auVar331._8_4_ = 0x3f3504f3;
                  auVar331._0_8_ = 0x3f3504f33f3504f3;
                  auVar331._12_4_ = 0x3f3504f3;
                  auVar363 = vcmpps_avx(auVar419,auVar331,1);
                  auVar127 = vandps_avx(auVar363,auVar419);
                  auVar184._0_4_ = auVar127._0_4_ + auVar419._0_4_ + -1.0;
                  auVar184._4_4_ = auVar127._4_4_ + auVar419._4_4_ + -1.0;
                  auVar184._8_4_ = auVar127._8_4_ + auVar419._8_4_ + -1.0;
                  auVar184._12_4_ = auVar127._12_4_ + auVar419._12_4_ + -1.0;
                  auVar127 = vandps_avx(auVar363,auVar338);
                  auVar363 = vsubps_avx(auVar346,auVar127);
                  auVar392._0_4_ = auVar184._0_4_ * auVar184._0_4_;
                  auVar392._4_4_ = auVar184._4_4_ * auVar184._4_4_;
                  auVar392._8_4_ = auVar184._8_4_ * auVar184._8_4_;
                  auVar392._12_4_ = auVar184._12_4_ * auVar184._12_4_;
                  auVar406._8_4_ = 0x3d9021bb;
                  auVar406._0_8_ = 0x3d9021bb3d9021bb;
                  auVar406._12_4_ = 0x3d9021bb;
                  auVar304._8_4_ = 0xbdebd1b8;
                  auVar304._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar304._12_4_ = 0xbdebd1b8;
                  auVar127 = vfmadd213ps_fma(auVar406,auVar184,auVar304);
                  auVar305._8_4_ = 0x3def251a;
                  auVar305._0_8_ = 0x3def251a3def251a;
                  auVar305._12_4_ = 0x3def251a;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar305);
                  auVar306._8_4_ = 0xbdfe5d4f;
                  auVar306._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar306._12_4_ = 0xbdfe5d4f;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar306);
                  auVar307._8_4_ = 0x3e11e9bf;
                  auVar307._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar307._12_4_ = 0x3e11e9bf;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar307);
                  auVar308._8_4_ = 0xbe2aae50;
                  auVar308._0_8_ = 0xbe2aae50be2aae50;
                  auVar308._12_4_ = 0xbe2aae50;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar308);
                  auVar309._8_4_ = 0x3e4cceac;
                  auVar309._0_8_ = 0x3e4cceac3e4cceac;
                  auVar309._12_4_ = 0x3e4cceac;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar309);
                  auVar310._8_4_ = 0xbe7ffffc;
                  auVar310._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar310._12_4_ = 0xbe7ffffc;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar310);
                  auVar311._8_4_ = 0x3eaaaaaa;
                  auVar311._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar311._12_4_ = 0x3eaaaaaa;
                  auVar127 = vfmadd213ps_fma(auVar127,auVar184,auVar311);
                  auVar312._0_4_ = auVar127._0_4_ * auVar392._0_4_ * auVar184._0_4_;
                  auVar312._4_4_ = auVar127._4_4_ * auVar392._4_4_ * auVar184._4_4_;
                  auVar312._8_4_ = auVar127._8_4_ * auVar392._8_4_ * auVar184._8_4_;
                  auVar312._12_4_ = auVar127._12_4_ * auVar392._12_4_ * auVar184._12_4_;
                  auVar407._8_4_ = 0xb95e8083;
                  auVar407._0_8_ = 0xb95e8083b95e8083;
                  auVar407._12_4_ = 0xb95e8083;
                  auVar127 = vfmadd231ps_fma(auVar312,auVar363,auVar407);
                  auVar346 = vfmsub231ps_fma(auVar127,auVar396,auVar392);
                  auVar458 = ZEXT1664(auVar418);
                  auVar153 = ZEXT1664(auVar70);
                  auVar452 = ZEXT1664(auVar111);
                  auVar459 = ZEXT1664(auVar71);
                  auVar340 = ZEXT1664(auVar230);
                  auVar395 = ZEXT1664(auVar349);
                  auVar39._12_4_ = 0;
                  auVar39._0_12_ = ZEXT412(0);
                  auVar152 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar127 = vcmpps_avx(auVar72,auVar39 << 0x20,2);
                  auVar346 = vsubps_avx(auVar346,auVar184);
                  auVar363 = vfnmadd231ps_fma(auVar346,auVar349,auVar363);
                  auVar185._0_4_ = auVar363._0_4_ + auVar363._0_4_;
                  auVar185._4_4_ = auVar363._4_4_ + auVar363._4_4_;
                  auVar185._8_4_ = auVar363._8_4_ + auVar363._8_4_;
                  auVar185._12_4_ = auVar363._12_4_ + auVar363._12_4_;
                  auVar313._8_4_ = 0x7fffffff;
                  auVar313._0_8_ = 0x7fffffff7fffffff;
                  auVar313._12_4_ = 0x7fffffff;
                  auVar127 = vblendvps_avx(auVar185,auVar313,auVar127);
                  auVar127 = vminps_avx(auVar303,auVar127);
                  auVar363 = vmaxps_avx(auVar418,auVar127);
                  auVar127 = vfmadd213ps_fma(auVar70,auVar363,auVar396);
                  auVar314._0_4_ = (int)auVar127._0_4_;
                  auVar314._4_4_ = (int)auVar127._4_4_;
                  auVar314._8_4_ = (int)auVar127._8_4_;
                  auVar314._12_4_ = (int)auVar127._12_4_;
                  auVar418 = vcvtdq2ps_avx(auVar314);
                  auVar127 = vcmpps_avx(auVar127,auVar418,1);
                  auVar127 = vandps_avx(auVar127,auVar338);
                  auVar127 = vsubps_avx(auVar418,auVar127);
                  auVar349 = vfmsub231ps_fma(auVar363,auVar127,auVar349);
                  auVar315._8_4_ = 0xb95e8083;
                  auVar315._0_8_ = 0xb95e8083b95e8083;
                  auVar315._12_4_ = 0xb95e8083;
                  auVar349 = vfnmsub231ps_fma(auVar349,auVar127,auVar315);
                  auVar316._0_4_ = auVar349._0_4_ * auVar349._0_4_;
                  auVar316._4_4_ = auVar349._4_4_ * auVar349._4_4_;
                  auVar316._8_4_ = auVar349._8_4_ * auVar349._8_4_;
                  auVar316._12_4_ = auVar349._12_4_ * auVar349._12_4_;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar111);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar71);
                  auVar332._8_4_ = 0x3d2aa9c1;
                  auVar332._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar332._12_4_ = 0x3d2aa9c1;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar332);
                  auVar387 = ZEXT1664(auVar396);
                  auVar84._8_4_ = 0x3e2aaaaa;
                  auVar84._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar84._12_4_ = 0x3e2aaaaa;
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar84);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar349,auVar396);
                  auVar230 = vfmadd213ps_fma(auVar230,auVar316,auVar349);
                  auVar128._0_4_ = auVar230._0_4_ + 1.0;
                  auVar128._4_4_ = auVar230._4_4_ + 1.0;
                  auVar128._8_4_ = auVar230._8_4_ + 1.0;
                  auVar128._12_4_ = auVar230._12_4_ + 1.0;
                  auVar186._0_4_ = (int)auVar127._0_4_;
                  auVar186._4_4_ = (int)auVar127._4_4_;
                  auVar186._8_4_ = (int)auVar127._8_4_;
                  auVar186._12_4_ = (int)auVar127._12_4_;
                  auVar230 = vpslld_avx(auVar186,0x17);
                  auVar230 = vpaddd_avx(auVar230,auVar338);
                  auVar396 = vfmadd213ps_fma(auVar230,auVar128,auVar338);
                  auVar230 = vrcpps_avx(auVar396);
                  auVar317._0_4_ = auVar230._0_4_ + auVar230._0_4_;
                  auVar317._4_4_ = auVar230._4_4_ + auVar230._4_4_;
                  auVar317._8_4_ = auVar230._8_4_ + auVar230._8_4_;
                  auVar317._12_4_ = auVar230._12_4_ + auVar230._12_4_;
                  auVar85._8_4_ = 0x40000000;
                  auVar85._0_8_ = 0x4000000040000000;
                  auVar85._12_4_ = 0x40000000;
                  auVar396 = vfmsub213ps_fma(auVar396,auVar317,auVar85);
                  auVar230 = vfnmadd213ps_fma(auVar396,auVar230,auVar317);
                  auVar471 = vfmsub231ps_fma(auVar471,auVar471,auVar230);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar132._4_4_ = uVar1;
                  auVar132._0_4_ = uVar1;
                  auVar132._8_4_ = uVar1;
                  auVar132._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar189._4_4_ = uVar1;
                  auVar189._0_4_ = uVar1;
                  auVar189._8_4_ = uVar1;
                  auVar189._12_4_ = uVar1;
                  auVar230 = vfmadd231ps_fma(auVar189,auVar471,auVar132);
                  auVar230 = vmaxps_avx(auVar127,auVar230);
                  auVar230 = vminps_avx(auVar230,auVar338);
                  auVar471._0_4_ = auVar471._0_4_ * auVar230._0_4_;
                  auVar471._4_4_ = fVar69 * auVar230._4_4_;
                  auVar471._8_4_ = fVar68 * auVar230._8_4_;
                  auVar471._12_4_ = fVar485 * auVar230._12_4_;
                }
                *(undefined1 (*) [16])ppp_Var56 = auVar471;
                ppp_Var56 = ppp_Var56 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_c8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar8 == 4) && (local_144 == 1)) && (local_40 = (long)local_c8.c, 0 < local_40)) {
      p_Var48 = local_70[-3];
      iVar54 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar53 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar47 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      iVar65 = *(int *)(&this->field_0x114 + (long)p_Var48);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_48 = CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize) * local_c8.cstep;
      local_50 = (Allocator *)local_c8.data;
      iVar46 = bottom_blob->w;
      iVar55 = bottom_blob->h;
      uVar13 = bottom_blob->c;
      local_1a0 = 0;
      do {
        if (0 < iVar7) {
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          local_178 = (_func_int ***)((long)&local_50->_vptr_Allocator + local_48 * local_1a0);
          pvVar67 = (this->weight_data_tm).data;
          iVar64 = 0;
          do {
            if (0 < iVar6) {
              iVar42 = bottom_blob->w;
              pvVar16 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pfVar21 = *(float **)(&this->field_0x118 + (long)p_Var48);
              uVar62 = 0;
              iVar41 = (1 - uVar10) * iVar54;
              do {
                if (lVar60 == 0) {
                  fVar69 = 0.0;
                }
                else {
                  fVar69 = *(float *)(lVar60 + local_1a0 * 4);
                }
                if ((int)uVar13 < 1) {
                  auVar230 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar340 = ZEXT864(0);
                  uVar59 = 0;
                  pvVar63 = (void *)(sVar17 * local_1a0 * sVar18 + (long)pvVar67);
                  do {
                    if (0 < (int)uVar11) {
                      uVar57 = 0;
                      uVar66 = 0;
                      do {
                        iVar43 = (((int)uVar66 - uVar11) + 1) * iVar53 + iVar64;
                        if (((-1 < iVar43) && (iVar44 = iVar43 / iVar9, iVar43 % iVar9 == 0)) &&
                           ((0 < (int)uVar10 && (iVar44 < iVar55)))) {
                          uVar61 = (ulong)uVar10;
                          uVar58 = uVar57;
                          iVar43 = iVar41;
                          do {
                            if (((-1 < iVar43) && (iVar45 = iVar43 / iVar47, iVar43 % iVar47 == 0))
                               && (iVar45 < iVar46)) {
                              auVar230 = vfmadd231ps_fma(auVar340._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar16 +
                                                          (long)(iVar45 << 2) * 4 +
                                                          (long)iVar44 * (long)iVar42 * sVar19 +
                                                          sVar20 * sVar19 * uVar59),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar63 + (uVar58 & 0xffffffff) * 4
                                                          ));
                              auVar340 = ZEXT1664(auVar230);
                            }
                            uVar58 = uVar58 + 4;
                            iVar43 = iVar43 + iVar54;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar66 = uVar66 + 1;
                        uVar57 = uVar57 + (ulong)uVar10 * 4;
                      } while (uVar66 != uVar11);
                    }
                    auVar230 = auVar340._0_16_;
                    pvVar63 = (void *)((long)pvVar63 + (long)(int)(uVar10 * uVar11 * 4) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar13);
                }
                auVar396 = vshufpd_avx(auVar230,auVar230,1);
                auVar133._0_4_ = auVar396._0_4_ + auVar230._0_4_;
                auVar133._4_4_ = auVar396._4_4_ + auVar230._4_4_;
                auVar133._8_4_ = auVar396._8_4_ + auVar230._8_4_;
                auVar133._12_4_ = auVar396._12_4_ + auVar230._12_4_;
                auVar230 = vmovshdup_avx(auVar133);
                fVar69 = auVar230._0_4_ + fVar69 + auVar133._0_4_;
                auVar230 = ZEXT416((uint)fVar69);
                fVar68 = fVar69;
                if (iVar65 - 1U < 6) {
                  switch(iVar65) {
                  case 1:
                    auVar230 = vmaxss_avx(ZEXT416((uint)fVar69),ZEXT416(0));
                    fVar68 = auVar230._0_4_;
                    break;
                  case 2:
                    auVar88._0_12_ = ZEXT812(0);
                    auVar88._12_4_ = 0;
                    auVar230 = vcmpss_avx(auVar88,ZEXT416((uint)fVar69),1);
                    auVar191._8_4_ = 0x3f800000;
                    auVar191._0_8_ = 0x3f8000003f800000;
                    auVar191._12_4_ = 0x3f800000;
                    auVar230 = vblendvps_avx(ZEXT416((uint)*pfVar21),auVar191,auVar230);
                    fVar68 = auVar230._0_4_ * fVar69;
                    break;
                  case 3:
                    auVar230 = vmaxss_avx(auVar230,ZEXT416((uint)*pfVar21));
                    fVar68 = auVar230._0_4_;
                    if (pfVar21[1] < auVar230._0_4_) {
                      fVar68 = pfVar21[1];
                    }
                    break;
                  case 4:
                    auVar230 = vminss_avx(auVar230,ZEXT416(0x42b0c0a5));
                    auVar134._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
                    auVar134._8_4_ = auVar230._8_4_ ^ 0x80000000;
                    auVar134._12_4_ = auVar230._12_4_ ^ 0x80000000;
                    auVar230 = vcmpss_avx(auVar230,ZEXT416(0xc2b0c0a5),1);
                    auVar190._8_4_ = 0x42b0c0a5;
                    auVar190._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar190._12_4_ = 0x42b0c0a5;
                    auVar230 = vblendvps_avx(auVar134,auVar190,auVar230);
                    fVar69 = expf(auVar230._0_4_);
                    fVar68 = 1.0 / (fVar69 + 1.0);
                    break;
                  case 5:
                    fVar68 = expf(fVar69);
                    fVar68 = logf(fVar68 + 1.0);
                    fVar68 = tanhf(fVar68);
                    fVar68 = fVar68 * fVar69;
                    break;
                  case 6:
                    fVar485 = *pfVar21;
                    fVar228 = -pfVar21[1] / fVar485;
                    fVar68 = 0.0;
                    if ((fVar228 <= fVar69) && (fVar68 = fVar69, fVar69 <= fVar228 + 1.0 / fVar485))
                    {
                      auVar230 = vfmadd213ss_fma(ZEXT416((uint)fVar485),auVar230,
                                                 ZEXT416((uint)pfVar21[1]));
                      fVar68 = auVar230._0_4_ * fVar69;
                    }
                  }
                }
                *(float *)local_178 = fVar68;
                local_178 = (_func_int ***)((long)local_178 + 4);
                uVar62 = uVar62 + 1;
                iVar41 = iVar41 + 1;
              } while (uVar62 != iVar6);
            }
            iVar64 = iVar64 + 1;
          } while (iVar64 != iVar7);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_40);
    }
    iVar7 = local_c8.h;
    iVar6 = local_c8.w;
    pvVar67 = local_c8.data;
    if (((iVar8 == 1) && (local_144 == 1)) &&
       (pp_Var22 = this->_vptr_Deconvolution_x86_fma,
       0 < *(int *)(&this->field_0xd0 + (long)pp_Var22[-3]))) {
      iVar53 = (int)local_78 * (int)local_68;
      lVar60 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize);
      iVar8 = bottom_blob->w;
      iVar54 = bottom_blob->h;
      uVar10 = bottom_blob->c;
      uVar59 = (ulong)(uint)local_c8.w;
      lVar51 = (long)local_c8.w;
      local_5c = -local_5c;
      local_178 = (_func_int ***)0x0;
      do {
        if (0 < iVar7) {
          local_128 = (_func_int ***)((long)(_func_int ***)pvVar67 + lVar60 * (long)local_178);
          pp_Var23 = this->_vptr_Deconvolution_x86_fma;
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          pvVar16 = (this->weight_data_tm).data;
          iVar47 = 0;
          do {
            if (0 < iVar6) {
              pvVar63 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pp_Var24 = this->_vptr_Deconvolution_x86_fma;
              local_68 = (long)bottom_blob->w * sVar19;
              uVar66 = 0;
              iVar9 = local_5c;
              do {
                p_Var48 = pp_Var23[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var48) == 0) {
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar340 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var48) +
                                              (long)local_178 * 4));
                }
                auVar230 = auVar340._0_16_;
                if (0 < (int)uVar10) {
                  p_Var48 = pp_Var24[-3];
                  uVar57 = 0;
                  local_78 = (void *)(sVar17 * sVar18 * (long)local_178 + (long)pvVar16);
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var48)) {
                      iVar65 = 0;
                      do {
                        iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var48) * iVar65 +
                                 (iVar47 - iVar52);
                        if (((-1 < iVar46) &&
                            (iVar55 = iVar46 / *(int *)(&this->field_0xe8 + (long)p_Var48),
                            iVar46 % *(int *)(&this->field_0xe8 + (long)p_Var48) == 0)) &&
                           (iVar55 < iVar54)) {
                          iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var48);
                          if (0 < (long)iVar46) {
                            lVar49 = 0;
                            iVar64 = iVar9;
                            do {
                              if (((-1 < iVar64) &&
                                  (iVar41 = iVar64 / *(int *)(&this->field_0xe4 + (long)p_Var48),
                                  iVar64 % *(int *)(&this->field_0xe4 + (long)p_Var48) == 0)) &&
                                 (iVar41 < iVar8)) {
                                auVar230 = vfmadd231ss_fma(auVar340._0_16_,
                                                           ZEXT416(*(uint *)((long)local_78 +
                                                                            lVar49 * 4 +
                                                                            (ulong)(uint)(iVar46 * 
                                                  iVar65) * 4)),
                                                  ZEXT416(*(uint *)((long)pvVar63 +
                                                                   (long)iVar41 * 4 +
                                                                   (long)iVar55 * local_68 +
                                                                   sVar20 * sVar19 * uVar57)));
                                auVar340 = ZEXT1664(auVar230);
                              }
                              lVar49 = lVar49 + 1;
                              iVar64 = iVar64 + *(int *)(&this->field_0xdc + (long)p_Var48);
                            } while (iVar46 != lVar49);
                          }
                        }
                        iVar65 = iVar65 + 1;
                      } while (iVar65 != *(int *)(&this->field_0xd8 + (long)p_Var48));
                    }
                    auVar230 = auVar340._0_16_;
                    uVar57 = uVar57 + 1;
                    local_78 = (void *)((long)local_78 + (long)iVar53 * 4);
                  } while (uVar57 != uVar10);
                }
                p_Var48 = pp_Var23[-3];
                fVar68 = auVar230._0_4_;
                fVar69 = fVar68;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var48)) {
                case 1:
                  auVar230 = vmaxss_avx(auVar230,ZEXT416(0));
                  fVar69 = auVar230._0_4_;
                  break;
                case 2:
                  auVar230 = vcmpss_avx(ZEXT816(0) << 0x40,auVar230,1);
                  auVar193._8_4_ = 0x3f800000;
                  auVar193._0_8_ = 0x3f8000003f800000;
                  auVar193._12_4_ = 0x3f800000;
                  auVar230 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var48)),
                                           auVar193,auVar230);
                  fVar69 = auVar230._0_4_ * fVar68;
                  break;
                case 3:
                  fVar68 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar230 = vmaxss_avx(auVar230,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var48)));
                  fVar69 = auVar230._0_4_;
                  if (fVar68 < auVar230._0_4_) {
                    fVar69 = fVar68;
                  }
                  break;
                case 4:
                  auVar230 = vminss_avx(auVar230,ZEXT416(0x42b0c0a5));
                  auVar135._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
                  auVar135._8_4_ = auVar230._8_4_ ^ 0x80000000;
                  auVar135._12_4_ = auVar230._12_4_ ^ 0x80000000;
                  auVar230 = vcmpss_avx(auVar230,ZEXT416(0xc2b0c0a5),1);
                  auVar192._8_4_ = 0x42b0c0a5;
                  auVar192._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar192._12_4_ = 0x42b0c0a5;
                  auVar230 = vblendvps_avx(auVar135,auVar192,auVar230);
                  fVar69 = expf(auVar230._0_4_);
                  fVar69 = 1.0 / (fVar69 + 1.0);
                  break;
                case 5:
                  local_78 = (void *)CONCAT44(local_78._4_4_,fVar68);
                  fVar69 = expf(fVar68);
                  fVar69 = logf(fVar69 + 1.0);
                  fVar69 = tanhf(fVar69);
                  fVar69 = fVar69 * local_78._0_4_;
                  break;
                case 6:
                  fVar485 = **(float **)(&this->field_0x118 + (long)p_Var48);
                  fVar228 = (*(float **)(&this->field_0x118 + (long)p_Var48))[1];
                  fVar229 = -fVar228 / fVar485;
                  fVar69 = 0.0;
                  if ((fVar229 <= fVar68) && (fVar69 = fVar68, fVar68 <= fVar229 + 1.0 / fVar485)) {
                    auVar230 = vfmadd213ss_fma(ZEXT416((uint)fVar485),auVar230,
                                               ZEXT416((uint)fVar228));
                    fVar69 = auVar230._0_4_ * fVar68;
                  }
                }
                *(float *)((long)local_128 + uVar66 * 4) = fVar69;
                uVar66 = uVar66 + 1;
                iVar9 = iVar9 + 1;
              } while (uVar66 != uVar59);
            }
            local_128 = (_func_int ***)((long)local_128 + lVar51 * 4);
            iVar47 = iVar47 + 1;
          } while (iVar47 != iVar7);
        }
        local_178 = (_func_int ***)((long)local_178 + 1);
      } while ((long)local_178 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var22[-3]));
    }
    pMVar40 = local_58;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_fma +
               (long)this->_vptr_Deconvolution_x86_fma[-3]),&local_c8,local_58,local_38);
    iVar54 = -100;
    if ((pMVar40->data != (void *)0x0) && (iVar54 = -100, (long)pMVar40->c * pMVar40->cstep != 0)) {
      iVar54 = 0;
    }
  }
  piVar15 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar54;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}